

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_1,_true,_embree::sse2::SubGridIntersector1Pluecker<4,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  ulong uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  RTCIntersectArguments *pRVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  unkbyte10 Var28;
  undefined1 auVar29 [12];
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined1 (*pauVar33) [16];
  undefined4 uVar34;
  ulong uVar35;
  long lVar36;
  Scene *pSVar37;
  RayHit *pRVar38;
  int iVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [16];
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  undefined4 uVar45;
  undefined8 unaff_R12;
  ulong uVar46;
  undefined1 auVar47 [8];
  RTCRayQueryContext *pRVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  int iVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  int iVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar114;
  float fVar133;
  float fVar134;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar135;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  float fVar142;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [16];
  float fVar158;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar164;
  float fVar165;
  undefined1 auVar160 [16];
  float fVar166;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  byte bVar199;
  char cVar200;
  byte bVar215;
  char cVar216;
  byte bVar217;
  char cVar218;
  char cVar219;
  char cVar220;
  char cVar221;
  char cVar222;
  byte bVar224;
  undefined1 auVar204 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vint<4> sy;
  vfloat<4> tNear;
  vint<4> sx;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_149d;
  undefined1 local_149c [4];
  undefined1 local_1498 [8];
  float fStack_1490;
  float afStack_148c [3];
  ulong local_1480;
  undefined1 local_1478 [8];
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1468 [8];
  float fStack_1460;
  float fStack_145c;
  RayQueryContext *local_1458;
  ulong local_1450;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  undefined1 local_1428 [16];
  undefined1 (*local_1418) [16];
  ulong local_1410;
  RTCFilterFunctionNArguments local_1408;
  undefined1 local_13d8 [8];
  float fStack_13d0;
  float fStack_13cc;
  undefined8 local_13c8;
  float fStack_13c0;
  float fStack_13bc;
  undefined8 local_13b8;
  float fStack_13b0;
  float fStack_13ac;
  float local_13a8;
  float local_13a4;
  float local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  uint local_138c;
  uint local_1388;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  long local_1360;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  undefined1 local_1318 [8];
  float fStack_1310;
  float fStack_130c;
  undefined1 local_1308 [8];
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  undefined8 local_12e8;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  undefined1 local_1288 [16];
  undefined1 *local_1278;
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  float local_1208 [4];
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  ulong local_11a8;
  long local_11a0;
  long local_1198;
  ulong local_1190;
  ulong local_1188;
  ulong local_1180;
  long local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [8];
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [16];
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  uint local_1118;
  uint uStack_1114;
  uint uStack_1110;
  uint uStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  float fVar113;
  undefined1 auVar205 [16];
  undefined1 auVar201 [11];
  undefined1 auVar206 [16];
  undefined1 auVar212 [16];
  undefined1 auVar202 [12];
  undefined1 auVar207 [16];
  undefined1 auVar203 [13];
  undefined1 auVar208 [16];
  undefined1 auVar213 [16];
  undefined1 auVar210 [16];
  undefined1 auVar209 [16];
  undefined2 uVar223;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar41 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar113 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar136 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar142 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar66 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar8 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar114 = (ray->super_RayK<1>).tfar;
    local_1058 = 0.0;
    if (0.0 <= fVar114) {
      local_1058 = fVar114;
    }
    uVar49 = -(uint)(1e-18 <= ABS(aVar8.x));
    uVar51 = -(uint)(1e-18 <= ABS(aVar8.y));
    uVar56 = -(uint)(1e-18 <= ABS(aVar8.z));
    uVar61 = -(uint)(1e-18 <= ABS(aVar8.field_3.w));
    auVar115 = divps(_DAT_01f46a60,(undefined1  [16])aVar8);
    auVar83._0_4_ = auVar115._0_4_ & uVar49;
    auVar83._4_4_ = auVar115._4_4_ & uVar51;
    auVar83._8_4_ = auVar115._8_4_ & uVar56;
    auVar83._12_4_ = auVar115._12_4_ & uVar61;
    auVar115._0_8_ = CONCAT44(~uVar51,~uVar49) & 0x5d5e0b6b5d5e0b6b;
    auVar115._8_4_ = ~uVar56 & 0x5d5e0b6b;
    auVar115._12_4_ = ~uVar61 & 0x5d5e0b6b;
    auVar115 = auVar115 | auVar83;
    fVar167 = auVar115._0_4_ * 0.99999964;
    fVar171 = auVar115._4_4_ * 0.99999964;
    fVar173 = auVar115._8_4_ * 0.99999964;
    fVar176 = auVar115._0_4_ * 1.0000004;
    fVar183 = auVar115._4_4_ * 1.0000004;
    fVar186 = auVar115._8_4_ * 1.0000004;
    fVar114 = 0.0;
    if (0.0 <= fVar66) {
      fVar114 = fVar66;
    }
    auVar146._4_4_ = fVar176;
    auVar146._0_4_ = fVar176;
    auVar146._8_4_ = fVar176;
    auVar146._12_4_ = fVar176;
    uVar42 = (ulong)(fVar167 < 0.0) << 4;
    uVar44 = (ulong)(fVar171 < 0.0) << 4 | 0x20;
    uVar40 = (ulong)(fVar173 < 0.0) << 4 | 0x40;
    auVar160._4_4_ = fVar114;
    auVar160._0_4_ = fVar114;
    auVar160._8_4_ = fVar114;
    auVar160._12_4_ = fVar114;
    local_11a8 = (ulong)(((uint)(fVar167 < 0.0) << 4) >> 2);
    local_1160 = uVar42 ^ 0x10;
    local_11b0 = (uVar42 ^ 0x10) >> 2;
    local_11b8 = uVar44 >> 2;
    local_1168 = uVar44 ^ 0x10;
    local_11c0 = (uVar44 ^ 0x10) >> 2;
    local_11c8 = uVar40 >> 2;
    local_1170 = uVar40 ^ 0x10;
    local_11d0 = (uVar40 ^ 0x10) >> 2;
    _local_1118 = mm_lookupmask_ps._240_8_;
    _uStack_1110 = mm_lookupmask_ps._248_8_;
    local_1458 = context;
    local_10a8 = fVar186;
    fStack_10a4 = fVar186;
    fStack_10a0 = fVar186;
    fStack_109c = fVar186;
    local_10b8 = fVar142;
    fStack_10b4 = fVar142;
    fStack_10b0 = fVar142;
    fStack_10ac = fVar142;
    local_1138 = auVar160;
    local_10c8 = fVar173;
    fStack_10c4 = fVar173;
    fStack_10c0 = fVar173;
    fStack_10bc = fVar173;
    local_1158 = fVar113;
    fStack_1154 = fVar113;
    fStack_1150 = fVar113;
    fStack_114c = fVar113;
    local_10d8 = fVar136;
    fStack_10d4 = fVar136;
    fStack_10d0 = fVar136;
    fStack_10cc = fVar136;
    local_1180 = uVar42;
    local_11f8 = fVar167;
    fStack_11f4 = fVar167;
    fStack_11f0 = fVar167;
    fStack_11ec = fVar167;
    local_10e8 = fVar171;
    fStack_10e4 = fVar171;
    fStack_10e0 = fVar171;
    fStack_10dc = fVar171;
    _local_1148 = auVar146;
    local_1358 = fVar183;
    fStack_1354 = fVar183;
    fStack_1350 = fVar183;
    fStack_134c = fVar183;
    local_1188 = uVar44;
    local_1190 = uVar40;
    fVar114 = fVar167;
    fVar66 = fVar167;
    fVar176 = fVar167;
    fStack_1054 = local_1058;
    fVar133 = local_1058;
    fVar134 = local_1058;
    fVar135 = fVar171;
    fVar149 = fVar171;
    fVar156 = fVar171;
    fVar157 = fVar142;
    fVar158 = fVar142;
    fVar159 = fVar142;
    fVar164 = fVar183;
    fVar165 = fVar183;
    fVar166 = fVar183;
    fVar168 = fVar173;
    fVar172 = fVar173;
    fVar174 = fVar173;
    fVar175 = fVar186;
    fVar177 = fVar186;
    fVar178 = fVar186;
    fVar184 = fVar113;
    fVar185 = fVar113;
    fVar187 = fVar113;
    fVar188 = fVar136;
    fVar189 = fVar136;
    fVar190 = fVar136;
LAB_005a7047:
    if (pauVar41 != (undefined1 (*) [16])&local_f78) {
      pauVar33 = pauVar41 + -1;
      pauVar41 = pauVar41 + -1;
      pfVar6 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar33 + 8) < *pfVar6 || *(float *)((long)*pauVar33 + 8) == *pfVar6) {
        uVar35 = *(ulong *)*pauVar41;
        while ((uVar35 & 8) == 0) {
          pfVar6 = (float *)(uVar35 + 0x20 + uVar42);
          auVar98._0_4_ = (*pfVar6 - fVar113) * fVar167;
          auVar98._4_4_ = (pfVar6[1] - fVar184) * fVar114;
          auVar98._8_4_ = (pfVar6[2] - fVar185) * fVar66;
          auVar98._12_4_ = (pfVar6[3] - fVar187) * fVar176;
          pfVar6 = (float *)(uVar35 + 0x20 + uVar44);
          auVar81._0_4_ = (*pfVar6 - fVar136) * fVar171;
          auVar81._4_4_ = (pfVar6[1] - fVar188) * fVar135;
          auVar81._8_4_ = (pfVar6[2] - fVar189) * fVar149;
          auVar81._12_4_ = (pfVar6[3] - fVar190) * fVar156;
          auVar115 = maxps(auVar98,auVar81);
          pfVar6 = (float *)(uVar35 + 0x20 + uVar40);
          auVar82._0_4_ = (*pfVar6 - fVar142) * fVar173;
          auVar82._4_4_ = (pfVar6[1] - fVar157) * fVar168;
          auVar82._8_4_ = (pfVar6[2] - fVar158) * fVar172;
          auVar82._12_4_ = (pfVar6[3] - fVar159) * fVar174;
          pfVar6 = (float *)(uVar35 + 0x20 + local_1160);
          auVar97._0_4_ = (*pfVar6 - fVar113) * auVar146._0_4_;
          auVar97._4_4_ = (pfVar6[1] - fVar184) * auVar146._4_4_;
          auVar97._8_4_ = (pfVar6[2] - fVar185) * auVar146._8_4_;
          auVar97._12_4_ = (pfVar6[3] - fVar187) * auVar146._12_4_;
          pfVar6 = (float *)(uVar35 + 0x20 + local_1168);
          auVar116._0_4_ = (*pfVar6 - fVar136) * fVar183;
          auVar116._4_4_ = (pfVar6[1] - fVar188) * fVar164;
          auVar116._8_4_ = (pfVar6[2] - fVar189) * fVar165;
          auVar116._12_4_ = (pfVar6[3] - fVar190) * fVar166;
          auVar98 = minps(auVar97,auVar116);
          pfVar6 = (float *)(uVar35 + 0x20 + local_1170);
          auVar117._0_4_ = (*pfVar6 - fVar142) * fVar186;
          auVar117._4_4_ = (pfVar6[1] - fVar157) * fVar175;
          auVar117._8_4_ = (pfVar6[2] - fVar158) * fVar177;
          auVar117._12_4_ = (pfVar6[3] - fVar159) * fVar178;
          auVar83 = maxps(auVar82,auVar160);
          _local_12a8 = maxps(auVar115,auVar83);
          auVar121._4_4_ = fStack_1054;
          auVar121._0_4_ = local_1058;
          auVar121._8_4_ = fVar133;
          auVar121._12_4_ = fVar134;
          auVar115 = minps(auVar117,auVar121);
          auVar115 = minps(auVar98,auVar115);
          auVar144._4_4_ = -(uint)(local_12a8._4_4_ <= auVar115._4_4_);
          auVar144._0_4_ = -(uint)(local_12a8._0_4_ <= auVar115._0_4_);
          auVar144._8_4_ = -(uint)(local_12a8._8_4_ <= auVar115._8_4_);
          auVar144._12_4_ = -(uint)(local_12a8._12_4_ <= auVar115._12_4_);
          uVar49 = movmskps((int)local_1170,auVar144);
          if (uVar49 == 0) goto LAB_005a7047;
          uVar49 = uVar49 & 0xff;
          uVar46 = uVar35 & 0xfffffffffffffff0;
          lVar36 = 0;
          if (uVar49 != 0) {
            for (; (uVar49 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
            }
          }
          uVar35 = *(ulong *)(uVar46 + lVar36 * 8);
          uVar49 = uVar49 - 1 & uVar49;
          if (uVar49 != 0) {
            uVar51 = *(uint *)(local_12a8 + lVar36 * 4);
            lVar36 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar46 + lVar36 * 8);
            uVar56 = *(uint *)(local_12a8 + lVar36 * 4);
            uVar49 = uVar49 - 1 & uVar49;
            if (uVar49 == 0) {
              if (uVar51 < uVar56) {
                *(ulong *)*pauVar41 = uVar9;
                *(uint *)((long)*pauVar41 + 8) = uVar56;
                pauVar41 = pauVar41 + 1;
              }
              else {
                *(ulong *)*pauVar41 = uVar35;
                *(uint *)((long)*pauVar41 + 8) = uVar51;
                pauVar41 = pauVar41 + 1;
                uVar35 = uVar9;
              }
            }
            else {
              auVar67._8_4_ = uVar51;
              auVar67._0_8_ = uVar35;
              auVar67._12_4_ = 0;
              auVar84._8_4_ = uVar56;
              auVar84._0_8_ = uVar9;
              auVar84._12_4_ = 0;
              lVar36 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              uVar35 = *(ulong *)(uVar46 + lVar36 * 8);
              iVar39 = *(int *)(local_12a8 + lVar36 * 4);
              auVar99._8_4_ = iVar39;
              auVar99._0_8_ = uVar35;
              auVar99._12_4_ = 0;
              auVar118._8_4_ = -(uint)((int)uVar51 < (int)uVar56);
              uVar49 = uVar49 - 1 & uVar49;
              fVar164 = fStack_1354;
              fVar165 = fStack_1350;
              fVar166 = fStack_134c;
              fVar183 = local_1358;
              if (uVar49 == 0) {
                auVar118._4_4_ = auVar118._8_4_;
                auVar118._0_4_ = auVar118._8_4_;
                auVar118._12_4_ = auVar118._8_4_;
                auVar115 = auVar67 & auVar118 | ~auVar118 & auVar84;
                auVar83 = auVar84 & auVar118 | ~auVar118 & auVar67;
                auVar119._8_4_ = -(uint)(auVar115._8_4_ < iVar39);
                auVar119._0_8_ = CONCAT44(auVar119._8_4_,auVar119._8_4_);
                auVar119._12_4_ = auVar119._8_4_;
                uVar35 = ~auVar119._0_8_ & uVar35 | auVar115._0_8_ & auVar119._0_8_;
                auVar115 = auVar99 & auVar119 | ~auVar119 & auVar115;
                auVar68._8_4_ = -(uint)(auVar83._8_4_ < auVar115._8_4_);
                auVar68._4_4_ = auVar68._8_4_;
                auVar68._0_4_ = auVar68._8_4_;
                auVar68._12_4_ = auVar68._8_4_;
                *pauVar41 = ~auVar68 & auVar83 | auVar115 & auVar68;
                pauVar41[1] = auVar83 & auVar68 | ~auVar68 & auVar115;
                pauVar41 = pauVar41 + 2;
              }
              else {
                lVar36 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                iVar55 = *(int *)(local_12a8 + lVar36 * 4);
                auVar137._8_4_ = iVar55;
                auVar137._0_8_ = *(undefined8 *)(uVar46 + lVar36 * 8);
                auVar137._12_4_ = 0;
                auVar120._4_4_ = auVar118._8_4_;
                auVar120._0_4_ = auVar118._8_4_;
                auVar120._8_4_ = auVar118._8_4_;
                auVar120._12_4_ = auVar118._8_4_;
                auVar115 = auVar67 & auVar120 | ~auVar120 & auVar84;
                auVar83 = auVar84 & auVar120 | ~auVar120 & auVar67;
                auVar143._0_4_ = -(uint)(iVar39 < iVar55);
                auVar143._4_4_ = -(uint)(iVar39 < iVar55);
                auVar143._8_4_ = -(uint)(iVar39 < iVar55);
                auVar143._12_4_ = -(uint)(iVar39 < iVar55);
                auVar121 = auVar99 & auVar143 | ~auVar143 & auVar137;
                auVar144 = ~auVar143 & auVar99 | auVar137 & auVar143;
                auVar100._8_4_ = -(uint)(auVar83._8_4_ < auVar144._8_4_);
                auVar100._4_4_ = auVar100._8_4_;
                auVar100._0_4_ = auVar100._8_4_;
                auVar100._12_4_ = auVar100._8_4_;
                auVar98 = auVar83 & auVar100 | ~auVar100 & auVar144;
                auVar85._8_4_ = -(uint)(auVar115._8_4_ < auVar121._8_4_);
                auVar85._0_8_ = CONCAT44(auVar85._8_4_,auVar85._8_4_);
                auVar85._12_4_ = auVar85._8_4_;
                uVar35 = auVar115._0_8_ & auVar85._0_8_ | ~auVar85._0_8_ & auVar121._0_8_;
                auVar115 = ~auVar85 & auVar115 | auVar121 & auVar85;
                auVar69._8_4_ = -(uint)(auVar115._8_4_ < auVar98._8_4_);
                auVar69._4_4_ = auVar69._8_4_;
                auVar69._0_4_ = auVar69._8_4_;
                auVar69._12_4_ = auVar69._8_4_;
                *pauVar41 = ~auVar100 & auVar83 | auVar144 & auVar100;
                pauVar41[1] = ~auVar69 & auVar115 | auVar98 & auVar69;
                pauVar41[2] = auVar115 & auVar69 | ~auVar69 & auVar98;
                pauVar41 = pauVar41 + 3;
                fVar167 = local_11f8;
                fVar114 = fStack_11f4;
                fVar66 = fStack_11f0;
                fVar176 = fStack_11ec;
                fVar113 = local_1158;
                fVar184 = fStack_1154;
                fVar185 = fStack_1150;
                fVar187 = fStack_114c;
              }
            }
          }
        }
        local_11a0 = (ulong)((uint)uVar35 & 0xf) - 8;
        uVar35 = uVar35 & 0xfffffffffffffff0;
        fStack_1050 = fVar133;
        fStack_104c = fVar134;
        local_1418 = pauVar41;
        for (local_1198 = 0; local_1198 != local_11a0; local_1198 = local_1198 + 1) {
          lVar36 = local_1198 * 0x58;
          local_1178 = lVar36 + uVar35;
          uVar7 = *(undefined8 *)(uVar35 + 0x20 + lVar36);
          uVar45 = *(undefined4 *)(uVar35 + 0x24 + lVar36);
          bVar224 = (byte)uVar7;
          bVar199 = (byte)uVar45;
          bVar14 = (byte)((ulong)uVar7 >> 8);
          bVar215 = (byte)((uint)uVar45 >> 8);
          bVar15 = (byte)((ulong)uVar7 >> 0x10);
          bVar217 = (byte)((uint)uVar45 >> 0x10);
          bVar19 = (byte)((uint)uVar45 >> 0x18);
          bVar16 = (byte)((ulong)uVar7 >> 0x18);
          cVar200 = -((byte)((bVar224 < bVar199) * bVar224 | (bVar224 >= bVar199) * bVar199) ==
                     bVar224);
          cVar216 = -((byte)((bVar14 < bVar215) * bVar14 | (bVar14 >= bVar215) * bVar215) == bVar14)
          ;
          cVar218 = -((byte)((bVar15 < bVar217) * bVar15 | (bVar15 >= bVar217) * bVar217) == bVar15)
          ;
          cVar219 = -((byte)((bVar16 < bVar19) * bVar16 | (bVar16 >= bVar19) * bVar19) == bVar16);
          cVar220 = -((char)((ulong)uVar7 >> 0x20) == '\0');
          cVar221 = -((char)((ulong)uVar7 >> 0x28) == '\0');
          cVar222 = -((char)((ulong)uVar7 >> 0x30) == '\0');
          bVar224 = -((char)((ulong)uVar7 >> 0x38) == '\0');
          auVar205._0_9_ = CONCAT18(0xff,(ulong)bVar224 << 0x38);
          auVar201._0_10_ = CONCAT19(0xff,auVar205._0_9_);
          auVar201[10] = 0xff;
          auVar202[0xb] = 0xff;
          auVar202._0_11_ = auVar201;
          auVar203[0xc] = 0xff;
          auVar203._0_12_ = auVar202;
          auVar210[0xd] = 0xff;
          auVar210._0_13_ = auVar203;
          fVar114 = *(float *)(uVar35 + 0x38 + lVar36);
          fVar66 = *(float *)(uVar35 + 0x3c + lVar36);
          fVar167 = *(float *)(uVar35 + 0x44 + lVar36);
          uVar49 = *(uint *)(local_11a8 + 0x20 + local_1178);
          auVar20[0xc] = (char)(uVar49 >> 0x18);
          auVar20._0_12_ = ZEXT712(0);
          uVar51 = *(uint *)(local_11b0 + 0x20 + local_1178);
          auVar21[0xc] = (char)(uVar51 >> 0x18);
          auVar21._0_12_ = ZEXT712(0);
          fVar183 = *(float *)(uVar35 + 0x48 + lVar36);
          uVar56 = *(uint *)(local_11b8 + 0x20 + local_1178);
          auVar22[0xc] = (char)(uVar56 >> 0x18);
          auVar22._0_12_ = ZEXT712(0);
          uVar61 = *(uint *)(local_11c0 + 0x20 + local_1178);
          auVar23[0xc] = (char)(uVar61 >> 0x18);
          auVar23._0_12_ = ZEXT712(0);
          fVar176 = *(float *)(uVar35 + 0x4c + lVar36);
          uVar50 = *(uint *)(local_11c8 + 0x20 + local_1178);
          auVar24[0xc] = (char)(uVar50 >> 0x18);
          auVar24._0_12_ = ZEXT712(0);
          uVar52 = *(uint *)(local_11d0 + 0x20 + local_1178);
          auVar25[0xc] = (char)(uVar52 >> 0x18);
          auVar25._0_12_ = ZEXT712(0);
          fVar164 = *(float *)(uVar35 + 0x40 + lVar36);
          auVar86._0_4_ = (((float)(uVar49 & 0xff) * fVar167 + fVar114) - fVar113) * local_11f8;
          auVar86._4_4_ =
               (((float)(uVar49 >> 8 & 0xff) * fVar167 + fVar114) - fVar184) * fStack_11f4;
          auVar86._8_4_ =
               (((float)(int)CONCAT32(auVar20._10_3_,(ushort)(byte)(uVar49 >> 0x10)) * fVar167 +
                fVar114) - fVar185) * fStack_11f0;
          auVar86._12_4_ =
               (((float)(uint3)(auVar20._10_3_ >> 0x10) * fVar167 + fVar114) - fVar187) *
               fStack_11ec;
          auVar138._0_4_ = (((float)(uVar56 & 0xff) * fVar183 + fVar66) - fVar136) * fVar171;
          auVar138._4_4_ = (((float)(uVar56 >> 8 & 0xff) * fVar183 + fVar66) - fVar188) * fVar135;
          auVar138._8_4_ =
               (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar56 >> 0x10)) * fVar183 +
                fVar66) - fVar189) * fVar149;
          auVar138._12_4_ =
               (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar183 + fVar66) - fVar190) * fVar156;
          auVar115 = maxps(auVar86,auVar138);
          auVar101._0_4_ =
               (((float)(uVar51 & 0xff) * fVar167 + fVar114) - fVar113) * (float)local_1148._0_4_;
          auVar101._4_4_ =
               (((float)(uVar51 >> 8 & 0xff) * fVar167 + fVar114) - fVar184) *
               (float)local_1148._4_4_;
          auVar101._8_4_ =
               (((float)(int)CONCAT32(auVar21._10_3_,(ushort)(byte)(uVar51 >> 0x10)) * fVar167 +
                fVar114) - fVar185) * fStack_1140;
          auVar101._12_4_ =
               (((float)(uint3)(auVar21._10_3_ >> 0x10) * fVar167 + fVar114) - fVar187) *
               fStack_113c;
          auVar122._0_4_ = (((float)(uVar61 & 0xff) * fVar183 + fVar66) - fVar136) * local_1358;
          auVar122._4_4_ =
               (((float)(uVar61 >> 8 & 0xff) * fVar183 + fVar66) - fVar188) * fStack_1354;
          auVar122._8_4_ =
               (((float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)(uVar61 >> 0x10)) * fVar183 +
                fVar66) - fVar189) * fStack_1350;
          auVar122._12_4_ =
               (((float)(uint3)(auVar23._10_3_ >> 0x10) * fVar183 + fVar66) - fVar190) * fStack_134c
          ;
          auVar83 = minps(auVar101,auVar122);
          auVar145._0_4_ = (((float)(uVar50 & 0xff) * fVar176 + fVar164) - fVar142) * fVar173;
          auVar145._4_4_ = (((float)(uVar50 >> 8 & 0xff) * fVar176 + fVar164) - fVar157) * fVar168;
          auVar145._8_4_ =
               (((float)(int)CONCAT32(auVar24._10_3_,(ushort)(byte)(uVar50 >> 0x10)) * fVar176 +
                fVar164) - fVar158) * fVar172;
          auVar145._12_4_ =
               (((float)(uint3)(auVar24._10_3_ >> 0x10) * fVar176 + fVar164) - fVar159) * fVar174;
          auVar146 = maxps(auVar145,local_1138);
          local_f88 = maxps(auVar115,auVar146);
          auVar150._0_4_ = (((float)(uVar52 & 0xff) * fVar176 + fVar164) - fVar142) * fVar186;
          auVar150._4_4_ = (((float)(uVar52 >> 8 & 0xff) * fVar176 + fVar164) - fVar157) * fVar175;
          auVar150._8_4_ =
               (((float)(int)CONCAT32(auVar25._10_3_,(ushort)(byte)(uVar52 >> 0x10)) * fVar176 +
                fVar164) - fVar158) * fVar177;
          auVar150._12_4_ =
               (((float)(uint3)(auVar25._10_3_ >> 0x10) * fVar176 + fVar164) - fVar159) * fVar178;
          auVar17._4_4_ = fStack_1054;
          auVar17._0_4_ = local_1058;
          auVar17._8_4_ = fVar133;
          auVar17._12_4_ = fVar134;
          auVar115 = minps(auVar150,auVar17);
          auVar115 = minps(auVar83,auVar115);
          auVar210[0xe] = bVar224;
          auVar210[0xf] = bVar224;
          auVar209._14_2_ = auVar210._14_2_;
          auVar209[0xd] = cVar222;
          auVar209._0_13_ = auVar203;
          auVar208._13_3_ = auVar209._13_3_;
          auVar208[0xc] = cVar222;
          auVar208._0_12_ = auVar202;
          auVar207._12_4_ = auVar208._12_4_;
          auVar207[0xb] = cVar221;
          auVar207._0_11_ = auVar201;
          auVar206._11_5_ = auVar207._11_5_;
          auVar206[10] = cVar221;
          auVar206._0_10_ = auVar201._0_10_;
          auVar205._10_6_ = auVar206._10_6_;
          auVar205[9] = cVar220;
          Var28 = CONCAT91(CONCAT81((long)(CONCAT72(auVar205._9_7_,CONCAT11(cVar220,bVar224)) >> 8),
                                    cVar219),cVar219);
          auVar27._2_10_ = Var28;
          auVar27[1] = cVar218;
          auVar27[0] = cVar218;
          auVar26._2_12_ = auVar27;
          auVar26[1] = cVar216;
          auVar26[0] = cVar216;
          auVar204._0_2_ = CONCAT11(cVar200,cVar200);
          auVar204._2_14_ = auVar26;
          uVar223 = (undefined2)Var28;
          auVar213._0_12_ = auVar204._0_12_;
          auVar213._12_2_ = uVar223;
          auVar213._14_2_ = uVar223;
          auVar212._12_4_ = auVar213._12_4_;
          auVar212._0_10_ = auVar204._0_10_;
          auVar212._10_2_ = auVar27._0_2_;
          auVar211._10_6_ = auVar212._10_6_;
          auVar211._0_8_ = auVar204._0_8_;
          auVar211._8_2_ = auVar27._0_2_;
          auVar29._4_8_ = auVar211._8_8_;
          auVar29._2_2_ = auVar26._0_2_;
          auVar29._0_2_ = auVar26._0_2_;
          uVar49 = CONCAT22(auVar204._0_2_,auVar204._0_2_);
          auVar87._0_4_ = -(uint)(local_f88._0_4_ <= auVar115._0_4_) & uVar49;
          auVar87._4_4_ = -(uint)(local_f88._4_4_ <= auVar115._4_4_) & auVar29._0_4_;
          auVar87._8_4_ = -(uint)(local_f88._8_4_ <= auVar115._8_4_) & auVar211._8_4_;
          auVar87._12_4_ = -(uint)(local_f88._12_4_ <= auVar115._12_4_) & auVar212._12_4_;
          uVar45 = movmskps((int)unaff_R12,auVar87);
          local_1410 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar45);
LAB_005a75b5:
          if (local_1410 != 0) {
            lVar36 = 0;
            if (local_1410 != 0) {
              for (; (local_1410 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            local_1410 = local_1410 & local_1410 - 1;
            fVar114 = (ray->super_RayK<1>).tfar;
            if (*(float *)(local_f88 + lVar36 * 4) <= fVar114) {
              local_f98 = ZEXT416((uint)fVar114);
              uVar49 = *(uint *)(local_1178 + 0x50);
              local_1480 = (ulong)uVar49;
              uVar51 = *(uint *)(local_1178 + 4 + lVar36 * 8);
              pSVar37 = context->scene;
              pGVar10 = (pSVar37->geometries).items[local_1480].ptr;
              auVar47 = *(undefined1 (*) [8])&pGVar10->field_0x58;
              local_1450 = (ulong)uVar51;
              local_1360 = (ulong)uVar51 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
              lVar11 = *(long *)&pGVar10[1].time_range.upper;
              uVar40 = *(ulong *)(local_1178 + lVar36 * 8);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar40;
              uVar42 = *(ulong *)((long)auVar47 + local_1360);
              uVar44 = (ulong)((int)((ulong)(SUB164(auVar70 & _DAT_01f76ac0,0) >> 0x10) *
                                    (uVar42 >> 0x20)) +
                              (int)uVar42 + (uint)SUB162(auVar70 & _DAT_01f76ac0,0));
              p_Var12 = pGVar10[1].intersectionFilterN;
              pfVar6 = (float *)(lVar11 + (long)p_Var12 * uVar44);
              pfVar1 = (float *)(lVar11 + (uVar44 + 1) * (long)p_Var12);
              local_1378 = *pfVar1;
              local_1078 = pfVar1[1];
              uVar42 = uVar42 >> 0x20;
              lVar36 = uVar44 + uVar42 + 1;
              pfVar2 = (float *)(lVar11 + (uVar44 + uVar42) * (long)p_Var12);
              local_12f8._0_4_ = *pfVar2;
              local_13d8._0_4_ = pfVar2[2];
              pfVar3 = (float *)(lVar11 + lVar36 * (long)p_Var12);
              local_13b8._0_4_ = *pfVar3;
              local_1478._0_4_ = pfVar3[1];
              local_13c8._0_4_ = pfVar3[2];
              uVar46 = (ulong)(-1 < (short)uVar40);
              pfVar3 = (float *)(lVar11 + (uVar44 + uVar46 + 1) * (long)p_Var12);
              fStack_1374 = *pfVar3;
              fStack_1074 = pfVar3[1];
              lVar43 = uVar46 + lVar36;
              uVar46 = 0;
              if (-1 < (short)(uVar40 >> 0x10)) {
                uVar46 = uVar42;
              }
              pfVar3 = (float *)(lVar11 + lVar43 * (long)p_Var12);
              local_13b8._4_4_ = *pfVar3;
              local_1478._4_4_ = pfVar3[1];
              local_13c8._4_4_ = pfVar3[2];
              pfVar3 = (float *)(lVar11 + (uVar44 + uVar42 + uVar46) * (long)p_Var12);
              pfVar4 = (float *)(lVar11 + (lVar36 + uVar46) * (long)p_Var12);
              local_13a4 = *pfVar4;
              fStack_146c = pfVar4[1];
              pfVar5 = (float *)(lVar11 + (uVar46 + lVar43) * (long)p_Var12);
              fStack_1470 = pfVar5[1];
              local_12e8 = CONCAT44(fStack_1374,local_1378);
              _local_12d8 = CONCAT44((float)local_13b8,local_13b8._4_4_);
              local_13c8 = CONCAT44(local_13c8._4_4_,(float)local_13c8);
              local_13b8 = CONCAT44(local_13b8._4_4_,(float)local_13b8);
              local_13a8 = *pfVar5;
              fVar113 = (ray->super_RayK<1>).org.field_0.m128[0];
              fVar136 = (ray->super_RayK<1>).org.field_0.m128[1];
              fVar142 = (ray->super_RayK<1>).org.field_0.m128[2];
              local_fb8 = pfVar6[1] - fVar136;
              fStack_fb4 = local_1078 - fVar136;
              fStack_fb0 = (float)local_1478._0_4_ - fVar136;
              fStack_fac = pfVar2[1] - fVar136;
              local_fa8 = pfVar6[2] - fVar142;
              fStack_fa4 = pfVar1[2] - fVar142;
              fStack_fa0 = (float)local_13c8 - fVar142;
              fStack_f9c = (float)local_13d8._0_4_ - fVar142;
              fStack_1080 = fStack_146c;
              fStack_107c = pfVar3[1];
              fVar176 = pfVar2[1] - fVar136;
              fVar133 = (float)local_1478._0_4_ - fVar136;
              fVar134 = fStack_146c - fVar136;
              fVar135 = pfVar3[1] - fVar136;
              local_1068 = CONCAT44((float)local_13c8,local_13d8._0_4_);
              local_1058 = pfVar4[2];
              fStack_1054 = pfVar3[2];
              local_13d8._0_4_ = (float)local_13d8._0_4_ - fVar142;
              local_13d8._4_4_ = (float)local_13c8 - fVar142;
              fStack_13d0 = pfVar4[2] - fVar142;
              fStack_13cc = pfVar3[2] - fVar142;
              local_1438 = fVar176;
              fStack_1434 = fVar133;
              fStack_1430 = fVar134;
              fStack_142c = fVar135;
              local_fd8 = fVar176 - local_fb8;
              fStack_fd4 = fVar133 - fStack_fb4;
              fStack_fd0 = fVar134 - fStack_fb0;
              fStack_fcc = fVar135 - fStack_fac;
              local_fc8 = (float)local_13d8._0_4_ - local_fa8;
              fStack_fc4 = (float)local_13d8._4_4_ - fStack_fa4;
              fStack_fc0 = fStack_13d0 - fStack_fa0;
              fStack_fbc = fStack_13cc - fStack_f9c;
              local_1468._0_4_ = *pfVar6 - fVar113;
              local_1468._4_4_ = local_1378 - fVar113;
              fStack_1460 = (float)local_13b8 - fVar113;
              fStack_145c = (float)local_12f8._0_4_ - fVar113;
              local_1098 = CONCAT44((float)local_13b8,local_12f8._0_4_);
              local_1088 = local_13a4;
              fStack_1084 = *pfVar3;
              local_12f8._0_4_ = (float)local_12f8._0_4_ - fVar113;
              local_12f8._4_4_ = (float)local_13b8 - fVar113;
              fStack_12f0 = local_13a4 - fVar113;
              fStack_12ec = *pfVar3 - fVar113;
              local_fe8 = (float)local_12f8._0_4_ - (float)local_1468._0_4_;
              fStack_fe4 = (float)local_12f8._4_4_ - (float)local_1468._4_4_;
              fStack_fe0 = fStack_12f0 - fStack_1460;
              fStack_fdc = fStack_12ec - fStack_145c;
              local_1498._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
              local_1448 = (ray->super_RayK<1>).dir.field_0.m128[1];
              local_12b8 = (ray->super_RayK<1>).dir.field_0.m128[2];
              local_1498._0_4_ = local_1498._4_4_;
              fStack_1490 = (float)local_1498._4_4_;
              afStack_148c[0] = (float)local_1498._4_4_;
              fVar173 = (local_fd8 * ((float)local_13d8._0_4_ + local_fa8) -
                        local_fc8 * (fVar176 + local_fb8)) * (float)local_1498._4_4_ +
                        (local_fc8 * ((float)local_12f8._0_4_ + (float)local_1468._0_4_) -
                        ((float)local_13d8._0_4_ + local_fa8) * local_fe8) * local_1448 +
                        ((fVar176 + local_fb8) * local_fe8 -
                        ((float)local_12f8._0_4_ + (float)local_1468._0_4_) * local_fd8) *
                        local_12b8;
              fVar186 = (fStack_fd4 * ((float)local_13d8._4_4_ + fStack_fa4) -
                        fStack_fc4 * (fVar133 + fStack_fb4)) * (float)local_1498._4_4_ +
                        (fStack_fc4 * ((float)local_12f8._4_4_ + (float)local_1468._4_4_) -
                        ((float)local_13d8._4_4_ + fStack_fa4) * fStack_fe4) * local_1448 +
                        ((fVar133 + fStack_fb4) * fStack_fe4 -
                        ((float)local_12f8._4_4_ + (float)local_1468._4_4_) * fStack_fd4) *
                        local_12b8;
              local_1018._0_8_ = CONCAT44(fVar186,fVar173);
              local_1018._8_4_ =
                   (fStack_fd0 * (fStack_13d0 + fStack_fa0) - fStack_fc0 * (fVar134 + fStack_fb0)) *
                   (float)local_1498._4_4_ +
                   (fStack_fc0 * (fStack_12f0 + fStack_1460) -
                   (fStack_13d0 + fStack_fa0) * fStack_fe0) * local_1448 +
                   ((fVar134 + fStack_fb0) * fStack_fe0 - (fStack_12f0 + fStack_1460) * fStack_fd0)
                   * local_12b8;
              local_1018._12_4_ =
                   (fStack_fcc * (fStack_13cc + fStack_f9c) - fStack_fbc * (fVar135 + fStack_fac)) *
                   (float)local_1498._4_4_ +
                   (fStack_fbc * (fStack_12ec + fStack_145c) -
                   (fStack_13cc + fStack_f9c) * fStack_fdc) * local_1448 +
                   ((fVar135 + fStack_fac) * fStack_fdc - (fStack_12ec + fStack_145c) * fStack_fcc)
                   * local_12b8;
              fStack_1070 = (float)local_1478._4_4_;
              fStack_106c = (float)local_1478._0_4_;
              local_1348 = fVar136;
              fStack_1344 = fVar136;
              fStack_1340 = fVar136;
              fStack_133c = fVar136;
              fVar168 = local_1078 - fVar136;
              fVar172 = fStack_1074 - fVar136;
              fVar174 = (float)local_1478._4_4_ - fVar136;
              fVar175 = (float)local_1478._0_4_ - fVar136;
              local_1338 = fVar142;
              fStack_1334 = fVar142;
              fStack_1330 = fVar142;
              fStack_132c = fVar142;
              fVar177 = local_13b8._4_4_ - fVar142;
              fVar184 = (float)local_13b8 - fVar142;
              fVar187 = fStack_12d0 - fVar142;
              fVar189 = fStack_12cc - fVar142;
              fVar191 = local_fb8 - fVar168;
              fVar192 = fStack_fb4 - fVar172;
              fVar193 = fStack_fb0 - fVar174;
              fVar194 = fStack_fac - fVar175;
              local_ff8 = local_fa8 - fVar177;
              fStack_ff4 = fStack_fa4 - fVar184;
              fStack_ff0 = fStack_fa0 - fVar187;
              fStack_fec = fStack_f9c - fVar189;
              local_1328 = fVar113;
              fStack_1324 = fVar113;
              fStack_1320 = fVar113;
              fStack_131c = fVar113;
              local_1378 = local_1378 - fVar113;
              fStack_1374 = fStack_1374 - fVar113;
              fStack_1370 = fStack_12e0 - fVar113;
              fStack_136c = fStack_12dc - fVar113;
              fVar195 = (float)local_1468._0_4_ - local_1378;
              fVar196 = (float)local_1468._4_4_ - fStack_1374;
              fVar197 = fStack_1460 - fStack_1370;
              fVar198 = fStack_145c - fStack_136c;
              local_1028._0_4_ =
                   (fVar191 * (local_fa8 + fVar177) - local_ff8 * (local_fb8 + fVar168)) *
                   (float)local_1498._4_4_ +
                   (local_ff8 * ((float)local_1468._0_4_ + local_1378) -
                   (local_fa8 + fVar177) * fVar195) * local_1448 +
                   ((local_fb8 + fVar168) * fVar195 -
                   ((float)local_1468._0_4_ + local_1378) * fVar191) * local_12b8;
              local_1028._4_4_ =
                   (fVar192 * (fStack_fa4 + fVar184) - fStack_ff4 * (fStack_fb4 + fVar172)) *
                   (float)local_1498._4_4_ +
                   (fStack_ff4 * ((float)local_1468._4_4_ + fStack_1374) -
                   (fStack_fa4 + fVar184) * fVar196) * local_1448 +
                   ((fStack_fb4 + fVar172) * fVar196 -
                   ((float)local_1468._4_4_ + fStack_1374) * fVar192) * local_12b8;
              local_1028._8_4_ =
                   (fVar193 * (fStack_fa0 + fVar187) - fStack_ff0 * (fStack_fb0 + fVar174)) *
                   (float)local_1498._4_4_ +
                   (fStack_ff0 * (fStack_1460 + fStack_1370) - (fStack_fa0 + fVar187) * fVar197) *
                   local_1448 +
                   ((fStack_fb0 + fVar174) * fVar197 - (fStack_1460 + fStack_1370) * fVar193) *
                   local_12b8;
              local_1028._12_4_ =
                   (fVar194 * (fStack_f9c + fVar189) - fStack_fec * (fStack_fac + fVar175)) *
                   (float)local_1498._4_4_ +
                   (fStack_fec * (fStack_145c + fStack_136c) - (fStack_f9c + fVar189) * fVar198) *
                   local_1448 +
                   ((fStack_fac + fVar175) * fVar198 - (fStack_145c + fStack_136c) * fVar194) *
                   local_12b8;
              local_1008 = fVar168 - fVar176;
              fStack_1004 = fVar172 - fVar133;
              fStack_1000 = fVar174 - fVar134;
              fStack_ffc = fVar175 - fVar135;
              fVar66 = fVar177 - (float)local_13d8._0_4_;
              fVar167 = fVar184 - (float)local_13d8._4_4_;
              fVar171 = fVar187 - fStack_13d0;
              fVar183 = fVar189 - fStack_13cc;
              local_1128 = fVar168;
              fStack_1124 = fVar172;
              fStack_1120 = fVar174;
              fStack_111c = fVar175;
              local_1308._0_4_ = fVar168 + fVar176;
              local_1308._4_4_ = fVar172 + fVar133;
              fStack_1300 = fVar174 + fVar134;
              fStack_12fc = fVar175 + fVar135;
              local_11e8 = fVar177;
              fStack_11e4 = fVar184;
              fStack_11e0 = fVar187;
              fStack_11dc = fVar189;
              local_1108 = fVar177 + (float)local_13d8._0_4_;
              fStack_1104 = fVar184 + (float)local_13d8._4_4_;
              fStack_1100 = fVar187 + fStack_13d0;
              fStack_10fc = fVar189 + fStack_13cc;
              fVar178 = local_1378 - (float)local_12f8._0_4_;
              fVar185 = fStack_1374 - (float)local_12f8._4_4_;
              fVar188 = fStack_1370 - fStack_12f0;
              fVar190 = fStack_136c - fStack_12ec;
              local_1318._0_4_ = local_1378 + (float)local_12f8._0_4_;
              local_1318._4_4_ = fStack_1374 + (float)local_12f8._4_4_;
              fStack_1310 = fStack_1370 + fStack_12f0;
              fStack_130c = fStack_136c + fStack_12ec;
              fStack_12b4 = local_12b8;
              fStack_12b0 = local_12b8;
              fStack_12ac = local_12b8;
              fStack_1444 = local_1448;
              fStack_1440 = local_1448;
              fStack_143c = local_1448;
              auVar139._0_4_ =
                   (local_1008 * local_1108 - fVar66 * (float)local_1308._0_4_) *
                   (float)local_1498._4_4_ +
                   (fVar66 * (float)local_1318._0_4_ - fVar178 * local_1108) * local_1448 +
                   (fVar178 * (float)local_1308._0_4_ - local_1008 * (float)local_1318._0_4_) *
                   local_12b8;
              auVar139._4_4_ =
                   (fStack_1004 * fStack_1104 - fVar167 * (float)local_1308._4_4_) *
                   (float)local_1498._4_4_ +
                   (fVar167 * (float)local_1318._4_4_ - fVar185 * fStack_1104) * local_1448 +
                   (fVar185 * (float)local_1308._4_4_ - fStack_1004 * (float)local_1318._4_4_) *
                   local_12b8;
              auVar139._8_4_ =
                   (fStack_1000 * fStack_1100 - fVar171 * fStack_1300) * (float)local_1498._4_4_ +
                   (fVar171 * fStack_1310 - fVar188 * fStack_1100) * local_1448 +
                   (fVar188 * fStack_1300 - fStack_1000 * fStack_1310) * local_12b8;
              auVar139._12_4_ =
                   (fStack_ffc * fStack_10fc - fVar183 * fStack_12fc) * (float)local_1498._4_4_ +
                   (fVar183 * fStack_130c - fVar190 * fStack_10fc) * local_1448 +
                   (fVar190 * fStack_12fc - fStack_ffc * fStack_130c) * local_12b8;
              fVar149 = fVar173 + local_1028._0_4_ + auVar139._0_4_;
              fVar156 = fVar186 + local_1028._4_4_ + auVar139._4_4_;
              fVar157 = local_1018._8_4_ + local_1028._8_4_ + auVar139._8_4_;
              fVar158 = local_1018._12_4_ + local_1028._12_4_ + auVar139._12_4_;
              auVar147._8_4_ = local_1018._8_4_;
              auVar147._0_8_ = local_1018._0_8_;
              auVar147._12_4_ = local_1018._12_4_;
              auVar115 = minps(auVar147,local_1028);
              auVar83 = minps(auVar115,auVar139);
              auVar123._8_4_ = local_1018._8_4_;
              auVar123._0_8_ = local_1018._0_8_;
              auVar123._12_4_ = local_1018._12_4_;
              auVar115 = maxps(auVar123,local_1028);
              auVar115 = maxps(auVar115,auVar139);
              fVar159 = ABS(fVar149);
              fVar164 = ABS(fVar156);
              fVar165 = ABS(fVar157);
              fVar166 = ABS(fVar158);
              auVar124._0_4_ =
                   -(uint)(auVar115._0_4_ <= fVar159 * 1.1920929e-07 ||
                          -(fVar159 * 1.1920929e-07) <= auVar83._0_4_) & local_1118;
              auVar124._4_4_ =
                   -(uint)(auVar115._4_4_ <= fVar164 * 1.1920929e-07 ||
                          -(fVar164 * 1.1920929e-07) <= auVar83._4_4_) & uStack_1114;
              auVar124._8_4_ =
                   -(uint)(auVar115._8_4_ <= fVar165 * 1.1920929e-07 ||
                          -(fVar165 * 1.1920929e-07) <= auVar83._8_4_) & uStack_1110;
              auVar124._12_4_ =
                   -(uint)(auVar115._12_4_ <= fVar166 * 1.1920929e-07 ||
                          -(fVar166 * 1.1920929e-07) <= auVar83._12_4_) & uStack_110c;
              iVar39 = movmskps((int)lVar11,auVar124);
              local_10f8 = local_13c8._4_4_;
              fStack_10f4 = local_13c8._4_4_;
              fStack_10f0 = local_13c8._4_4_;
              fStack_10ec = local_13c8._4_4_;
              fStack_12c4 = (float)local_13c8;
              local_12c8 = (float)local_13c8;
              fStack_12c0 = (float)local_13c8;
              fStack_12bc = (float)local_13c8;
              if (iVar39 != 0) {
                local_1048 = fVar159;
                fStack_1044 = fVar164;
                fStack_1040 = fVar165;
                fStack_103c = fVar166;
                local_1038 = fVar149;
                fStack_1034 = fVar156;
                fStack_1030 = fVar157;
                fStack_102c = fVar158;
                auVar161._0_4_ = local_fd8 * local_ff8 - local_fc8 * fVar191;
                auVar161._4_4_ = fStack_fd4 * fStack_ff4 - fStack_fc4 * fVar192;
                auVar161._8_4_ = fStack_fd0 * fStack_ff0 - fStack_fc0 * fVar193;
                auVar161._12_4_ = fStack_fcc * fStack_fec - fStack_fbc * fVar194;
                uVar56 = -(uint)(ABS(local_ff8 * local_1008) <= ABS(local_fc8 * fVar191));
                uVar52 = -(uint)(ABS(fStack_ff4 * fStack_1004) <= ABS(fStack_fc4 * fVar192));
                uVar57 = -(uint)(ABS(fStack_ff0 * fStack_1000) <= ABS(fStack_fc0 * fVar193));
                uVar62 = -(uint)(ABS(fStack_fec * fStack_ffc) <= ABS(fStack_fbc * fVar194));
                uVar61 = -(uint)(ABS(fVar195 * fVar66) <= ABS(local_fe8 * local_ff8));
                uVar53 = -(uint)(ABS(fVar196 * fVar167) <= ABS(fStack_fe4 * fStack_ff4));
                uVar58 = -(uint)(ABS(fVar197 * fVar171) <= ABS(fStack_fe0 * fStack_ff0));
                uVar63 = -(uint)(ABS(fVar198 * fVar183) <= ABS(fStack_fdc * fStack_fec));
                uVar50 = -(uint)(ABS(fVar191 * fVar178) <= ABS(local_fd8 * fVar195));
                uVar54 = -(uint)(ABS(fVar192 * fVar185) <= ABS(fStack_fd4 * fVar196));
                uVar59 = -(uint)(ABS(fVar193 * fVar188) <= ABS(fStack_fd0 * fVar197));
                uVar64 = -(uint)(ABS(fVar194 * fVar190) <= ABS(fStack_fcc * fVar198));
                local_1228._0_4_ =
                     ~uVar56 & (uint)auVar161._0_4_ |
                     (uint)(fVar191 * fVar66 - local_ff8 * local_1008) & uVar56;
                local_1228._4_4_ =
                     ~uVar52 & (uint)auVar161._4_4_ |
                     (uint)(fVar192 * fVar167 - fStack_ff4 * fStack_1004) & uVar52;
                fStack_1220 = (float)(~uVar57 & (uint)auVar161._8_4_ |
                                     (uint)(fVar193 * fVar171 - fStack_ff0 * fStack_1000) & uVar57);
                fStack_121c = (float)(~uVar62 & (uint)auVar161._12_4_ |
                                     (uint)(fVar194 * fVar183 - fStack_fec * fStack_ffc) & uVar62);
                local_1218._0_4_ =
                     ~uVar61 & (uint)(local_fc8 * fVar195 - local_fe8 * local_ff8) |
                     (uint)(local_ff8 * fVar178 - fVar195 * fVar66) & uVar61;
                local_1218._4_4_ =
                     ~uVar53 & (uint)(fStack_fc4 * fVar196 - fStack_fe4 * fStack_ff4) |
                     (uint)(fStack_ff4 * fVar185 - fVar196 * fVar167) & uVar53;
                fStack_1210 = (float)(~uVar58 & (uint)(fStack_fc0 * fVar197 -
                                                      fStack_fe0 * fStack_ff0) |
                                     (uint)(fStack_ff0 * fVar188 - fVar197 * fVar171) & uVar58);
                fStack_120c = (float)(~uVar63 & (uint)(fStack_fbc * fVar198 -
                                                      fStack_fdc * fStack_fec) |
                                     (uint)(fStack_fec * fVar190 - fVar198 * fVar183) & uVar63);
                local_1208[0] =
                     (float)(~uVar50 & (uint)(local_fe8 * fVar191 - local_fd8 * fVar195) |
                            (uint)(fVar195 * local_1008 - fVar191 * fVar178) & uVar50);
                local_1208[1] =
                     (float)(~uVar54 & (uint)(fStack_fe4 * fVar192 - fStack_fd4 * fVar196) |
                            (uint)(fVar196 * fStack_1004 - fVar192 * fVar185) & uVar54);
                local_1208[2] =
                     (float)(~uVar59 & (uint)(fStack_fe0 * fVar193 - fStack_fd0 * fVar197) |
                            (uint)(fVar197 * fStack_1000 - fVar193 * fVar188) & uVar59);
                local_1208[3] =
                     (float)(~uVar64 & (uint)(fStack_fdc * fVar194 - fStack_fcc * fVar198) |
                            (uint)(fVar198 * fStack_ffc - fVar194 * fVar190) & uVar64);
                fVar66 = (float)local_1498._4_4_ * (float)local_1228._0_4_ +
                         local_1448 * (float)local_1218._0_4_ + local_12b8 * local_1208[0];
                fVar167 = (float)local_1498._4_4_ * (float)local_1228._4_4_ +
                          local_1448 * (float)local_1218._4_4_ + local_12b8 * local_1208[1];
                fVar171 = (float)local_1498._4_4_ * fStack_1220 +
                          local_1448 * fStack_1210 + local_12b8 * local_1208[2];
                fVar183 = (float)local_1498._4_4_ * fStack_121c +
                          local_1448 * fStack_120c + local_12b8 * local_1208[3];
                auVar102._0_4_ = fVar66 + fVar66;
                auVar102._4_4_ = fVar167 + fVar167;
                auVar102._8_4_ = fVar171 + fVar171;
                auVar102._12_4_ = fVar183 + fVar183;
                fVar66 = (float)local_1468._0_4_ * (float)local_1228._0_4_ +
                         local_fb8 * (float)local_1218._0_4_ + local_fa8 * local_1208[0];
                fVar171 = (float)local_1468._4_4_ * (float)local_1228._4_4_ +
                          fStack_fb4 * (float)local_1218._4_4_ + fStack_fa4 * local_1208[1];
                fVar183 = fStack_1460 * fStack_1220 +
                          fStack_fb0 * fStack_1210 + fStack_fa0 * local_1208[2];
                fVar178 = fStack_145c * fStack_121c +
                          fStack_fac * fStack_120c + fStack_f9c * local_1208[3];
                auVar115 = rcpps(auVar161,auVar102);
                fVar167 = auVar115._0_4_;
                fVar185 = auVar115._4_4_;
                fVar188 = auVar115._8_4_;
                fVar190 = auVar115._12_4_;
                fVar167 = ((1.0 - auVar102._0_4_ * fVar167) * fVar167 + fVar167) * (fVar66 + fVar66)
                ;
                fVar171 = ((1.0 - auVar102._4_4_ * fVar185) * fVar185 + fVar185) *
                          (fVar171 + fVar171);
                fVar183 = ((1.0 - auVar102._8_4_ * fVar188) * fVar188 + fVar188) *
                          (fVar183 + fVar183);
                fVar178 = ((1.0 - auVar102._12_4_ * fVar190) * fVar190 + fVar190) *
                          (fVar178 + fVar178);
                fVar66 = (ray->super_RayK<1>).org.field_0.m128[3];
                iVar55 = -(uint)(fVar66 <= fVar171);
                iVar60 = -(uint)(fVar66 <= fVar183);
                iVar65 = -(uint)(fVar66 <= fVar178);
                auVar179._8_4_ = iVar60;
                auVar179._4_4_ = iVar55;
                auVar179._12_4_ = iVar65;
                auVar103._0_4_ =
                     (int)((uint)((fVar167 <= fVar114 && fVar66 <= fVar167) && auVar102._0_4_ != 0.0
                                 ) * -0x80000000) >> 0x1f;
                auVar103._4_4_ =
                     (int)((uint)((fVar171 <= fVar114 && fVar66 <= fVar171) && auVar102._4_4_ != 0.0
                                 ) * -0x80000000) >> 0x1f;
                auVar103._8_4_ =
                     (int)((uint)((fVar183 <= fVar114 && fVar66 <= fVar183) && auVar102._8_4_ != 0.0
                                 ) * -0x80000000) >> 0x1f;
                auVar103._12_4_ =
                     (int)((uint)((fVar178 <= fVar114 && fVar66 <= fVar178) &&
                                 auVar102._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                auVar104 = auVar103 & auVar124;
                iVar39 = movmskps(iVar39,auVar104);
                if (iVar39 != 0) {
                  local_1288._4_4_ = fVar156;
                  local_1288._0_4_ = fVar149;
                  local_1288._8_4_ = fVar157;
                  local_1288._12_4_ = fVar158;
                  local_1278 = &local_149d;
                  local_1268 = auVar104;
                  local_1238._4_4_ = fVar171;
                  local_1238._0_4_ = fVar167;
                  fStack_1230 = fVar183;
                  fStack_122c = fVar178;
                  auVar125._4_12_ = auVar124._4_12_;
                  auVar125._0_4_ = (float)(int)(*(ushort *)((long)auVar47 + 8 + local_1360) - 1);
                  auVar169._4_4_ = auVar124._4_4_;
                  auVar169._0_4_ = auVar125._0_4_;
                  auVar169._8_4_ = auVar124._8_4_;
                  auVar169._12_4_ = auVar124._12_4_;
                  auVar115 = rcpss(auVar169,auVar125);
                  local_1468 = auVar47;
                  auVar179._0_4_ = (float)(int)(*(ushort *)((long)auVar47 + 10 + local_1360) - 1);
                  fStack_129c = (2.0 - auVar125._0_4_ * auVar115._0_4_) * auVar115._0_4_;
                  auVar170._4_4_ = iVar55;
                  auVar170._0_4_ = auVar179._0_4_;
                  auVar170._8_4_ = iVar60;
                  auVar170._12_4_ = iVar65;
                  auVar115 = rcpss(auVar170,auVar179);
                  fVar114 = (2.0 - auVar179._0_4_ * auVar115._0_4_) * auVar115._0_4_;
                  local_12a8._0_4_ =
                       fStack_129c * (fVar173 + (float)(int)local_13c8._4_4_ * fVar149);
                  local_12a8._4_4_ =
                       fStack_129c * (fVar186 + (float)((int)local_13c8._4_4_ + 1) * fVar156);
                  fStack_12a0 = fStack_129c *
                                (local_1018._8_4_ + (float)((int)local_13c8._4_4_ + 1) * fVar157);
                  fStack_129c = fStack_129c *
                                (local_1018._12_4_ + (float)(int)local_13c8._4_4_ * fVar158);
                  auVar88._0_4_ = (float)(int)(float)local_13c8 * fVar149 + local_1028._0_4_;
                  auVar88._4_4_ = (float)(int)(float)local_13c8 * fVar156 + local_1028._4_4_;
                  auVar88._8_4_ = (float)((int)(float)local_13c8 + 1) * fVar157 + local_1028._8_4_;
                  auVar88._12_4_ = (float)((int)(float)local_13c8 + 1) * fVar158 + local_1028._12_4_
                  ;
                  local_1298._4_4_ = fVar114 * auVar88._4_4_;
                  local_1298._0_4_ = fVar114 * auVar88._0_4_;
                  fStack_1290 = fVar114 * auVar88._8_4_;
                  fStack_128c = fVar114 * auVar88._12_4_;
                  pGVar10 = (pSVar37->geometries).items[local_1480].ptr;
                  uVar56 = (ray->super_RayK<1>).mask;
                  pSVar37 = (Scene *)(ulong)uVar56;
                  if ((pGVar10->mask & uVar56) != 0) {
                    local_1428 = auVar104;
                    auVar115 = rcpps(auVar88,local_1288);
                    fVar66 = auVar115._0_4_;
                    fVar173 = auVar115._4_4_;
                    fVar186 = auVar115._8_4_;
                    fVar185 = auVar115._12_4_;
                    fVar66 = (float)(-(uint)(1e-18 <= fVar159) &
                                    (uint)(((float)DAT_01f46a60 - fVar149 * fVar66) * fVar66 +
                                          fVar66));
                    fVar173 = (float)(-(uint)(1e-18 <= fVar164) &
                                     (uint)((DAT_01f46a60._4_4_ - fVar156 * fVar173) * fVar173 +
                                           fVar173));
                    fVar186 = (float)(-(uint)(1e-18 <= fVar165) &
                                     (uint)((DAT_01f46a60._8_4_ - fVar157 * fVar186) * fVar186 +
                                           fVar186));
                    fVar149 = (float)(-(uint)(1e-18 <= fVar166) &
                                     (uint)((DAT_01f46a60._12_4_ - fVar158 * fVar185) * fVar185 +
                                           fVar185));
                    auVar71._0_4_ = (float)local_12a8._0_4_ * fVar66;
                    auVar71._4_4_ = (float)local_12a8._4_4_ * fVar173;
                    auVar71._8_4_ = fStack_12a0 * fVar186;
                    auVar71._12_4_ = fStack_129c * fVar149;
                    local_1258 = minps(auVar71,_DAT_01f46a60);
                    auVar126._0_4_ = fVar114 * auVar88._0_4_ * fVar66;
                    auVar126._4_4_ = fVar114 * auVar88._4_4_ * fVar173;
                    auVar126._8_4_ = fVar114 * auVar88._8_4_ * fVar186;
                    auVar126._12_4_ = fVar114 * auVar88._12_4_ * fVar149;
                    local_1248 = minps(auVar126,_DAT_01f46a60);
                    uVar61 = auVar104._0_4_;
                    auVar148._0_4_ = (uint)fVar167 & uVar61;
                    uVar50 = auVar104._4_4_;
                    auVar148._4_4_ = (uint)fVar171 & uVar50;
                    uVar52 = auVar104._8_4_;
                    auVar148._8_4_ = (uint)fVar183 & uVar52;
                    uVar53 = auVar104._12_4_;
                    auVar148._12_4_ = (uint)fVar178 & uVar53;
                    auVar89._0_8_ = CONCAT44(~uVar50,~uVar61) & 0x7f8000007f800000;
                    auVar89._8_4_ = ~uVar52 & 0x7f800000;
                    auVar89._12_4_ = ~uVar53 & 0x7f800000;
                    auVar89 = auVar89 | auVar148;
                    auVar127._4_4_ = auVar89._0_4_;
                    auVar127._0_4_ = auVar89._4_4_;
                    auVar127._8_4_ = auVar89._12_4_;
                    auVar127._12_4_ = auVar89._8_4_;
                    auVar115 = minps(auVar127,auVar89);
                    auVar72._0_8_ = auVar115._8_8_;
                    auVar72._8_4_ = auVar115._0_4_;
                    auVar72._12_4_ = auVar115._4_4_;
                    auVar115 = minps(auVar72,auVar115);
                    auVar73._0_8_ =
                         CONCAT44(-(uint)(auVar115._4_4_ == auVar89._4_4_) & uVar50,
                                  -(uint)(auVar115._0_4_ == auVar89._0_4_) & uVar61);
                    auVar73._8_4_ = -(uint)(auVar115._8_4_ == auVar89._8_4_) & uVar52;
                    auVar73._12_4_ = -(uint)(auVar115._12_4_ == auVar89._12_4_) & uVar53;
                    iVar39 = movmskps(uVar56,auVar73);
                    if (iVar39 != 0) {
                      auVar104._8_4_ = auVar73._8_4_;
                      auVar104._0_8_ = auVar73._0_8_;
                      auVar104._12_4_ = auVar73._12_4_;
                    }
                    uVar56 = movmskps(iVar39,auVar104);
                    lVar36 = 0;
                    if (uVar56 != 0) {
                      for (; (uVar56 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                      }
                    }
                    pRVar13 = context->args;
                    if ((pRVar13->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar114 = *(float *)(local_1258 + lVar36 * 4);
                      fVar66 = *(float *)(local_1248 + lVar36 * 4);
                      fVar167 = *(float *)(local_1228 + lVar36 * 4);
                      fVar171 = local_1208[lVar36 + -4];
                      fVar183 = local_1208[lVar36];
                      (ray->super_RayK<1>).tfar = *(float *)(local_1238 + lVar36 * 4);
                      (ray->Ng).field_0.field_0.x = fVar167;
                      (ray->Ng).field_0.field_0.y = fVar171;
                      (ray->Ng).field_0.field_0.z = fVar183;
                      ray->u = fVar114;
                      ray->v = fVar66;
                      ray->primID = uVar51;
                      ray->geomID = uVar49;
                      pRVar48 = context->user;
                      ray->instID[0] = pRVar48->instID[0];
                      uVar49 = pRVar48->instPrimID[0];
                      pSVar37 = (Scene *)(ulong)uVar49;
                      ray->instPrimID[0] = uVar49;
                    }
                    else {
                      pRVar48 = context->user;
                      _local_1498 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                      local_1448 = fVar167;
                      fStack_1444 = fVar171;
                      fStack_1440 = fVar183;
                      fStack_143c = fVar178;
                      while( true ) {
                        local_139c = *(undefined4 *)(local_1258 + lVar36 * 4);
                        local_1398 = *(undefined4 *)(local_1248 + lVar36 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1238 + lVar36 * 4);
                        local_13a8 = *(float *)(local_1228 + lVar36 * 4);
                        local_13a4 = local_1208[lVar36 + -4];
                        local_13a0 = local_1208[lVar36];
                        local_1394 = (int)local_1450;
                        local_1390 = (int)local_1480;
                        local_138c = pRVar48->instID[0];
                        local_1388 = pRVar48->instPrimID[0];
                        local_149c = (undefined1  [4])0xffffffff;
                        local_1408.valid = (int *)local_149c;
                        local_1408.geometryUserPtr = pGVar10->userPtr;
                        local_1408.context = pRVar48;
                        local_1408.ray = (RTCRayN *)ray;
                        local_1408.hit = (RTCHitN *)&local_13a8;
                        local_1408.N = 1;
                        if (((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                            ((*pGVar10->intersectionFilterN)(&local_1408), fVar167 = local_1448,
                            fVar171 = fStack_1444, fVar183 = fStack_1440, fVar178 = fStack_143c,
                            (((RayK<1> *)local_1408.valid)->org).field_0.m128[0] != 0.0)) &&
                           ((pRVar13->filter == (RTCFilterFunctionN)0x0 ||
                            ((((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                               RTC_RAY_QUERY_FLAG_INCOHERENT &&
                              (((pGVar10->field_8).field_0x2 & 0x40) == 0)) ||
                             ((*pRVar13->filter)(&local_1408), fVar167 = local_1448,
                             fVar171 = fStack_1444, fVar183 = fStack_1440, fVar178 = fStack_143c,
                             (((RayK<1> *)local_1408.valid)->org).field_0.m128[0] != 0.0)))))) {
                          (((Vec3f *)((long)local_1408.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_1408.hit;
                          (((Vec3f *)((long)local_1408.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_1408.hit + 4);
                          (((Vec3f *)((long)local_1408.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_1408.hit + 8);
                          *(float *)((long)local_1408.ray + 0x3c) = *(float *)(local_1408.hit + 0xc)
                          ;
                          *(float *)((long)local_1408.ray + 0x40) =
                               *(float *)(local_1408.hit + 0x10);
                          *(float *)((long)local_1408.ray + 0x44) =
                               *(float *)(local_1408.hit + 0x14);
                          *(float *)((long)local_1408.ray + 0x48) =
                               *(float *)(local_1408.hit + 0x18);
                          *(float *)((long)local_1408.ray + 0x4c) =
                               *(float *)(local_1408.hit + 0x1c);
                          *(float *)((long)local_1408.ray + 0x50) =
                               *(float *)(local_1408.hit + 0x20);
                          pRVar38 = (RayHit *)local_1408.ray;
                        }
                        else {
                          (ray->super_RayK<1>).tfar = (float)local_1498._0_4_;
                          pRVar38 = (RayHit *)local_1408.valid;
                          fVar167 = local_1448;
                          fVar171 = fStack_1444;
                          fVar183 = fStack_1440;
                          fVar178 = fStack_143c;
                        }
                        *(undefined4 *)(local_1428 + lVar36 * 4) = 0;
                        fVar114 = (ray->super_RayK<1>).tfar;
                        auVar79._0_4_ = -(uint)(fVar167 <= fVar114) & local_1428._0_4_;
                        auVar79._4_4_ = -(uint)(fVar171 <= fVar114) & local_1428._4_4_;
                        auVar79._8_4_ = -(uint)(fVar183 <= fVar114) & local_1428._8_4_;
                        auVar79._12_4_ = -(uint)(fVar178 <= fVar114) & local_1428._12_4_;
                        local_1428 = auVar79;
                        uVar45 = (undefined4)((ulong)pRVar38 >> 0x20);
                        iVar39 = movmskps((int)pRVar38,auVar79);
                        pSVar37 = (Scene *)CONCAT44(uVar45,iVar39);
                        if (iVar39 == 0) break;
                        local_1498._0_4_ = (ray->super_RayK<1>).tfar;
                        local_1498._4_4_ = (ray->super_RayK<1>).mask;
                        fStack_1490 = (float)(ray->super_RayK<1>).id;
                        afStack_148c[0] = (float)(ray->super_RayK<1>).flags;
                        auVar91._0_4_ = auVar79._0_4_ & (uint)fVar167;
                        auVar91._4_4_ = auVar79._4_4_ & (uint)fVar171;
                        auVar91._8_4_ = auVar79._8_4_ & (uint)fVar183;
                        auVar91._12_4_ = auVar79._12_4_ & (uint)fVar178;
                        auVar111._0_8_ =
                             CONCAT44(~auVar79._4_4_,~auVar79._0_4_) & 0x7f8000007f800000;
                        auVar111._8_4_ = ~auVar79._8_4_ & 0x7f800000;
                        auVar111._12_4_ = ~auVar79._12_4_ & 0x7f800000;
                        auVar111 = auVar111 | auVar91;
                        auVar131._4_4_ = auVar111._0_4_;
                        auVar131._0_4_ = auVar111._4_4_;
                        auVar131._8_4_ = auVar111._12_4_;
                        auVar131._12_4_ = auVar111._8_4_;
                        auVar115 = minps(auVar131,auVar111);
                        auVar92._0_8_ = auVar115._8_8_;
                        auVar92._8_4_ = auVar115._0_4_;
                        auVar92._12_4_ = auVar115._4_4_;
                        auVar115 = minps(auVar92,auVar115);
                        auVar93._0_8_ =
                             CONCAT44(-(uint)(auVar115._4_4_ == auVar111._4_4_) & auVar79._4_4_,
                                      -(uint)(auVar115._0_4_ == auVar111._0_4_) & auVar79._0_4_);
                        auVar93._8_4_ = -(uint)(auVar115._8_4_ == auVar111._8_4_) & auVar79._8_4_;
                        auVar93._12_4_ =
                             -(uint)(auVar115._12_4_ == auVar111._12_4_) & auVar79._12_4_;
                        iVar39 = movmskps(iVar39,auVar93);
                        if (iVar39 != 0) {
                          auVar79._8_4_ = auVar93._8_4_;
                          auVar79._0_8_ = auVar93._0_8_;
                          auVar79._12_4_ = auVar93._12_4_;
                        }
                        uVar34 = movmskps(iVar39,auVar79);
                        uVar40 = CONCAT44(uVar45,uVar34);
                        lVar36 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                          }
                        }
                      }
                      fVar113 = (ray->super_RayK<1>).org.field_0.m128[0];
                      fVar136 = (ray->super_RayK<1>).org.field_0.m128[1];
                      fVar142 = (ray->super_RayK<1>).org.field_0.m128[2];
                      local_1498._4_4_ = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
                      local_1448 = (ray->super_RayK<1>).dir.field_0.m128[1];
                      local_12b8 = (ray->super_RayK<1>).dir.field_0.m128[2];
                      fStack_1444 = local_1448;
                      fStack_1440 = local_1448;
                      fStack_143c = local_1448;
                      fStack_12b4 = local_12b8;
                      fStack_12b0 = local_12b8;
                      fStack_12ac = local_12b8;
                      fVar176 = local_1088 - fVar136;
                      fVar133 = fStack_1084 - fVar136;
                      fVar134 = fStack_1080 - fVar136;
                      fVar135 = fStack_107c - fVar136;
                      local_13d8._0_4_ = (float)local_1068 - fVar142;
                      local_13d8._4_4_ = local_1068._4_4_ - fVar142;
                      fStack_13d0 = fStack_1060 - fVar142;
                      fStack_13cc = fStack_105c - fVar142;
                      fVar168 = local_1078 - fVar136;
                      fVar172 = fStack_1074 - fVar136;
                      fVar174 = fStack_1070 - fVar136;
                      fVar175 = fStack_106c - fVar136;
                      fVar177 = local_12d8 - fVar142;
                      fVar184 = fStack_12d4 - fVar142;
                      fVar187 = fStack_12d0 - fVar142;
                      fVar189 = fStack_12cc - fVar142;
                      local_1318._4_4_ = (local_1098._4_4_ - fVar113) + (local_12e8._4_4_ - fVar113)
                      ;
                      local_1318._0_4_ =
                           ((float)local_1098 - fVar113) + ((float)local_12e8 - fVar113);
                      fStack_1310 = (fStack_1090 - fVar113) + (fStack_12e0 - fVar113);
                      fStack_130c = (fStack_108c - fVar113) + (fStack_12dc - fVar113);
                      local_1308._4_4_ = fVar133 + fVar172;
                      local_1308._0_4_ = fVar176 + fVar168;
                      fStack_1300 = fVar134 + fVar174;
                      fStack_12fc = fVar135 + fVar175;
                      local_1108 = (float)local_13d8._0_4_ + fVar177;
                      fStack_1104 = (float)local_13d8._4_4_ + fVar184;
                      fStack_1100 = fStack_13d0 + fVar187;
                      fStack_10fc = fStack_13cc + fVar189;
                      local_1378 = (float)local_12e8 - fVar113;
                      fStack_1374 = local_12e8._4_4_ - fVar113;
                      fStack_1370 = fStack_12e0 - fVar113;
                      fStack_136c = fStack_12dc - fVar113;
                      local_12f8._4_4_ = local_1098._4_4_ - fVar113;
                      local_12f8._0_4_ = (float)local_1098 - fVar113;
                      fStack_12f0 = fStack_1090 - fVar113;
                      fStack_12ec = fStack_108c - fVar113;
                      context = local_1458;
                      pauVar41 = local_1418;
                    }
                    local_1498._0_4_ = local_1498._4_4_;
                    fStack_1490 = (float)local_1498._4_4_;
                    afStack_148c[0] = (float)local_1498._4_4_;
                    auVar47 = local_1468;
                  }
                }
              }
              local_13c8._0_4_ = (float)local_13c8 - fVar142;
              local_13c8._4_4_ = local_13c8._4_4_ - fVar142;
              fStack_13c0 = fStack_13c0 - fVar142;
              fStack_13bc = fStack_13bc - fVar142;
              local_1478._0_4_ = (float)local_1478._0_4_ - fVar136;
              local_1478._4_4_ = (float)local_1478._4_4_ - fVar136;
              fStack_1470 = fStack_1470 - fVar136;
              fStack_146c = fStack_146c - fVar136;
              local_13b8._0_4_ = (float)local_13b8 - fVar113;
              local_13b8._4_4_ = local_13b8._4_4_ - fVar113;
              fStack_13b0 = fStack_13b0 - fVar113;
              fStack_13ac = fStack_13ac - fVar113;
              fVar171 = local_1378 - (float)local_13b8;
              fVar183 = fStack_1374 - local_13b8._4_4_;
              fVar173 = fStack_1370 - fStack_13b0;
              fVar149 = fStack_136c - fStack_13ac;
              fVar156 = fVar168 - (float)local_1478._0_4_;
              fVar157 = fVar172 - (float)local_1478._4_4_;
              fStack_12d0 = fVar174 - fStack_1470;
              fStack_12cc = fVar175 - fStack_146c;
              local_1438 = fVar177 - (float)local_13c8;
              fStack_1434 = fVar184 - local_13c8._4_4_;
              fStack_1430 = fVar187 - fStack_13c0;
              fStack_142c = fVar189 - fStack_13bc;
              auVar128._0_4_ = fVar176 - fVar168;
              auVar128._4_4_ = fVar133 - fVar172;
              auVar128._8_4_ = fVar134 - fVar174;
              auVar128._12_4_ = fVar135 - fVar175;
              fVar166 = (float)local_13d8._0_4_ - fVar177;
              fVar185 = (float)local_13d8._4_4_ - fVar184;
              fStack_12e0 = fStack_13d0 - fVar187;
              fStack_12dc = fStack_13cc - fVar189;
              fVar193 = (float)local_12f8._0_4_ - local_1378;
              fVar194 = (float)local_12f8._4_4_ - fStack_1374;
              fVar195 = fStack_12f0 - fStack_1370;
              fVar196 = fStack_12ec - fStack_136c;
              _local_12d8 = CONCAT44(fVar157,fVar156);
              local_1468._4_4_ = fVar183;
              local_1468._0_4_ = fVar171;
              fStack_1460 = fVar173;
              fStack_145c = fVar149;
              fVar136 = (float)local_1478._0_4_ - fVar176;
              fVar142 = (float)local_1478._4_4_ - fVar133;
              fVar66 = fStack_1470 - fVar134;
              fVar167 = fStack_146c - fVar135;
              fVar188 = (float)local_13c8 - (float)local_13d8._0_4_;
              fVar190 = local_13c8._4_4_ - (float)local_13d8._4_4_;
              fVar191 = fStack_13c0 - fStack_13d0;
              fVar192 = fStack_13bc - fStack_13cc;
              fVar114 = (fVar156 * (fVar177 + (float)local_13c8) -
                        local_1438 * (fVar168 + (float)local_1478._0_4_)) * (float)local_1498._0_4_
                        + (local_1438 * (local_1378 + (float)local_13b8) -
                          (fVar177 + (float)local_13c8) * fVar171) * fStack_143c +
                          ((fVar168 + (float)local_1478._0_4_) * fVar171 -
                          (local_1378 + (float)local_13b8) * fVar156) * fStack_12ac;
              fVar113 = (fVar157 * (fVar184 + local_13c8._4_4_) -
                        fStack_1434 * (fVar172 + (float)local_1478._4_4_)) * (float)local_1498._4_4_
                        + (fStack_1434 * (fStack_1374 + local_13b8._4_4_) -
                          (fVar184 + local_13c8._4_4_) * fVar183) * fStack_143c +
                          ((fVar172 + (float)local_1478._4_4_) * fVar183 -
                          (fStack_1374 + local_13b8._4_4_) * fVar157) * fStack_12ac;
              auVar105._0_8_ = CONCAT44(fVar113,fVar114);
              auVar105._8_4_ =
                   (fStack_12d0 * (fVar187 + fStack_13c0) - fStack_1430 * (fVar174 + fStack_1470)) *
                   fStack_1490 +
                   (fStack_1430 * (fStack_1370 + fStack_13b0) - (fVar187 + fStack_13c0) * fVar173) *
                   fStack_143c +
                   ((fVar174 + fStack_1470) * fVar173 - (fStack_1370 + fStack_13b0) * fStack_12d0) *
                   fStack_12ac;
              auVar105._12_4_ =
                   (fStack_12cc * (fVar189 + fStack_13bc) - fStack_142c * (fVar175 + fStack_146c)) *
                   afStack_148c[0] +
                   (fStack_142c * (fStack_136c + fStack_13ac) - (fVar189 + fStack_13bc) * fVar149) *
                   fStack_143c +
                   ((fVar175 + fStack_146c) * fVar149 - (fStack_136c + fStack_13ac) * fStack_12cc) *
                   fStack_12ac;
              fVar158 = (float)local_13b8 - (float)local_12f8._0_4_;
              fVar159 = local_13b8._4_4_ - (float)local_12f8._4_4_;
              fVar164 = fStack_13b0 - fStack_12f0;
              fVar165 = fStack_13ac - fStack_12ec;
              auVar162._0_4_ =
                   (fVar136 * ((float)local_13d8._0_4_ + (float)local_13c8) -
                   fVar188 * (fVar176 + (float)local_1478._0_4_)) * (float)local_1498._0_4_ +
                   (fVar188 * ((float)local_12f8._0_4_ + (float)local_13b8) -
                   ((float)local_13d8._0_4_ + (float)local_13c8) * fVar158) * fStack_143c +
                   ((fVar176 + (float)local_1478._0_4_) * fVar158 -
                   ((float)local_12f8._0_4_ + (float)local_13b8) * fVar136) * fStack_12ac;
              auVar162._4_4_ =
                   (fVar142 * ((float)local_13d8._4_4_ + local_13c8._4_4_) -
                   fVar190 * (fVar133 + (float)local_1478._4_4_)) * (float)local_1498._4_4_ +
                   (fVar190 * ((float)local_12f8._4_4_ + local_13b8._4_4_) -
                   ((float)local_13d8._4_4_ + local_13c8._4_4_) * fVar159) * fStack_143c +
                   ((fVar133 + (float)local_1478._4_4_) * fVar159 -
                   ((float)local_12f8._4_4_ + local_13b8._4_4_) * fVar142) * fStack_12ac;
              auVar162._8_4_ =
                   (fVar66 * (fStack_13d0 + fStack_13c0) - fVar191 * (fVar134 + fStack_1470)) *
                   fStack_1490 +
                   (fVar191 * (fStack_12f0 + fStack_13b0) - (fStack_13d0 + fStack_13c0) * fVar164) *
                   fStack_143c +
                   ((fVar134 + fStack_1470) * fVar164 - (fStack_12f0 + fStack_13b0) * fVar66) *
                   fStack_12ac;
              auVar162._12_4_ =
                   (fVar167 * (fStack_13cc + fStack_13bc) - fVar192 * (fVar135 + fStack_146c)) *
                   afStack_148c[0] +
                   (fVar192 * (fStack_12ec + fStack_13ac) - (fStack_13cc + fStack_13bc) * fVar165) *
                   fStack_143c +
                   ((fVar135 + fStack_146c) * fVar165 - (fStack_12ec + fStack_13ac) * fVar167) *
                   fStack_12ac;
              local_12e8 = CONCAT44(fVar185,fVar166);
              _local_13d8 = auVar128;
              auVar74._0_4_ =
                   (auVar128._0_4_ * local_1108 - fVar166 * (float)local_1308._0_4_) *
                   (float)local_1498._0_4_ +
                   (fVar166 * (float)local_1318._0_4_ - local_1108 * fVar193) * fStack_143c +
                   ((float)local_1308._0_4_ * fVar193 - (float)local_1318._0_4_ * auVar128._0_4_) *
                   fStack_12ac;
              auVar74._4_4_ =
                   (auVar128._4_4_ * fStack_1104 - fVar185 * (float)local_1308._4_4_) *
                   (float)local_1498._4_4_ +
                   (fVar185 * (float)local_1318._4_4_ - fStack_1104 * fVar194) * fStack_143c +
                   ((float)local_1308._4_4_ * fVar194 - (float)local_1318._4_4_ * auVar128._4_4_) *
                   fStack_12ac;
              auVar74._8_4_ =
                   (auVar128._8_4_ * fStack_1100 - fStack_12e0 * fStack_1300) * fStack_1490 +
                   (fStack_12e0 * fStack_1310 - fStack_1100 * fVar195) * fStack_143c +
                   (fStack_1300 * fVar195 - fStack_1310 * auVar128._8_4_) * fStack_12ac;
              auVar74._12_4_ =
                   (auVar128._12_4_ * fStack_10fc - fStack_12dc * fStack_12fc) * afStack_148c[0] +
                   (fStack_12dc * fStack_130c - fStack_10fc * fVar196) * fStack_143c +
                   (fStack_12fc * fVar196 - fStack_130c * auVar128._12_4_) * fStack_12ac;
              local_1468._0_4_ = fVar114 + auVar162._0_4_ + auVar74._0_4_;
              local_1468._4_4_ = fVar113 + auVar162._4_4_ + auVar74._4_4_;
              fStack_1460 = auVar105._8_4_ + auVar162._8_4_ + auVar74._8_4_;
              fStack_145c = auVar105._12_4_ + auVar162._12_4_ + auVar74._12_4_;
              uVar40 = CONCAT44(local_1468._4_4_,local_1468._0_4_);
              local_1318 = (undefined1  [8])(uVar40 & 0x7fffffff7fffffff);
              fStack_1310 = ABS(fStack_1460);
              fStack_130c = ABS(fStack_145c);
              auVar151._8_4_ = auVar105._8_4_;
              auVar151._0_8_ = auVar105._0_8_;
              auVar151._12_4_ = auVar105._12_4_;
              auVar115 = minps(auVar151,auVar162);
              auVar146 = minps(auVar115,auVar74);
              _local_12f8 = auVar105;
              auVar115 = maxps(auVar105,auVar162);
              auVar83 = maxps(auVar115,auVar74);
              auVar115 = _local_1318;
              auVar106._4_4_ =
                   -(uint)(auVar83._4_4_ <= ABS((float)local_1468._4_4_) * 1.1920929e-07);
              auVar106._0_4_ =
                   -(uint)(auVar83._0_4_ <= ABS((float)local_1468._0_4_) * 1.1920929e-07);
              auVar106._8_4_ = -(uint)(auVar83._8_4_ <= fStack_1310 * 1.1920929e-07);
              auVar106._12_4_ = -(uint)(auVar83._12_4_ <= fStack_130c * 1.1920929e-07);
              auVar152._4_4_ =
                   -(uint)(-(ABS((float)local_1468._4_4_) * 1.1920929e-07) <= auVar146._4_4_);
              auVar152._0_4_ =
                   -(uint)(-(ABS((float)local_1468._0_4_) * 1.1920929e-07) <= auVar146._0_4_);
              auVar152._8_4_ = -(uint)(-(fStack_1310 * 1.1920929e-07) <= auVar146._8_4_);
              auVar152._12_4_ = -(uint)(-(fStack_130c * 1.1920929e-07) <= auVar146._12_4_);
              auVar106 = auVar106 | auVar152;
              auVar107._0_4_ = auVar106._0_4_ & local_1118;
              auVar107._4_4_ = auVar106._4_4_ & uStack_1114;
              auVar107._8_4_ = auVar106._8_4_ & uStack_1110;
              auVar107._12_4_ = auVar106._12_4_ & uStack_110c;
              iVar39 = movmskps((int)pSVar37,auVar107);
              uVar40 = local_1190;
              uVar42 = local_1180;
              uVar44 = local_1188;
              fVar133 = fStack_1050;
              fVar134 = fStack_104c;
              fVar186 = local_10a8;
              fVar175 = fStack_10a4;
              fVar177 = fStack_10a0;
              fVar178 = fStack_109c;
              if (iVar39 != 0) {
                _local_1308 = auVar162;
                local_1448 = fStack_143c;
                fStack_1444 = fStack_143c;
                fStack_1440 = fStack_143c;
                uVar56 = (uint)DAT_01f46710;
                uVar52 = DAT_01f46710._4_4_;
                uVar57 = DAT_01f46710._8_4_;
                uVar62 = DAT_01f46710._12_4_;
                uVar49 = -(uint)((float)((uint)(fVar188 * auVar128._0_4_) & uVar56) <=
                                (float)((uint)(local_1438 * fVar136) & uVar56));
                uVar61 = -(uint)((float)((uint)(fVar190 * auVar128._4_4_) & uVar52) <=
                                (float)((uint)(fStack_1434 * fVar142) & uVar52));
                uVar53 = -(uint)((float)((uint)(fVar191 * auVar128._8_4_) & uVar57) <=
                                (float)((uint)(fStack_1430 * fVar66) & uVar57));
                uVar58 = -(uint)((float)((uint)(fVar192 * auVar128._12_4_) & uVar62) <=
                                (float)((uint)(fStack_142c * fVar167) & uVar62));
                uVar51 = -(uint)((float)((uint)(fVar158 * fVar166) & uVar56) <=
                                (float)((uint)(fVar171 * fVar188) & uVar56));
                uVar50 = -(uint)((float)((uint)(fVar159 * fVar185) & uVar52) <=
                                (float)((uint)(fVar183 * fVar190) & uVar52));
                uVar54 = -(uint)((float)((uint)(fVar164 * fStack_12e0) & uVar57) <=
                                (float)((uint)(fVar173 * fVar191) & uVar57));
                uVar59 = -(uint)((float)((uint)(fVar165 * fStack_12dc) & uVar62) <=
                                (float)((uint)(fVar149 * fVar192) & uVar62));
                uVar56 = -(uint)((float)((uint)(fVar136 * fVar193) & uVar56) <=
                                (float)((uint)(fVar156 * fVar158) & uVar56));
                uVar52 = -(uint)((float)((uint)(fVar142 * fVar194) & uVar52) <=
                                (float)((uint)(fVar157 * fVar159) & uVar52));
                uVar57 = -(uint)((float)((uint)(fVar66 * fVar195) & uVar57) <=
                                (float)((uint)(fStack_12d0 * fVar164) & uVar57));
                uVar62 = -(uint)((float)((uint)(fVar167 * fVar196) & uVar62) <=
                                (float)((uint)(fStack_12cc * fVar165) & uVar62));
                auVar140._0_4_ = (uint)(fVar136 * fVar166 - fVar188 * auVar128._0_4_) & uVar49;
                auVar140._4_4_ = (uint)(fVar142 * fVar185 - fVar190 * auVar128._4_4_) & uVar61;
                auVar140._8_4_ = (uint)(fVar66 * fStack_12e0 - fVar191 * auVar128._8_4_) & uVar53;
                auVar140._12_4_ = (uint)(fVar167 * fStack_12dc - fVar192 * auVar128._12_4_) & uVar58
                ;
                auVar214._0_4_ = ~uVar49 & (uint)(fVar156 * fVar188 - local_1438 * fVar136);
                auVar214._4_4_ = ~uVar61 & (uint)(fVar157 * fVar190 - fStack_1434 * fVar142);
                auVar214._8_4_ = ~uVar53 & (uint)(fStack_12d0 * fVar191 - fStack_1430 * fVar66);
                auVar214._12_4_ = ~uVar58 & (uint)(fStack_12cc * fVar192 - fStack_142c * fVar167);
                _local_1228 = auVar214 | auVar140;
                auVar153._0_4_ = ~uVar51 & (uint)(local_1438 * fVar158 - fVar171 * fVar188);
                auVar153._4_4_ = ~uVar50 & (uint)(fStack_1434 * fVar159 - fVar183 * fVar190);
                auVar153._8_4_ = ~uVar54 & (uint)(fStack_1430 * fVar164 - fVar173 * fVar191);
                auVar153._12_4_ = ~uVar59 & (uint)(fStack_142c * fVar165 - fVar149 * fVar192);
                auVar18._4_4_ = (uint)(fVar190 * fVar194 - fVar159 * fVar185) & uVar50;
                auVar18._0_4_ = (uint)(fVar188 * fVar193 - fVar158 * fVar166) & uVar51;
                auVar18._8_4_ = (uint)(fVar191 * fVar195 - fVar164 * fStack_12e0) & uVar54;
                auVar18._12_4_ = (uint)(fVar192 * fVar196 - fVar165 * fStack_12dc) & uVar59;
                _local_1218 = auVar153 | auVar18;
                local_1208[0] =
                     (float)(~uVar56 & (uint)(fVar171 * fVar136 - fVar156 * fVar158) |
                            (uint)(fVar158 * auVar128._0_4_ - fVar136 * fVar193) & uVar56);
                local_1208[1] =
                     (float)(~uVar52 & (uint)(fVar183 * fVar142 - fVar157 * fVar159) |
                            (uint)(fVar159 * auVar128._4_4_ - fVar142 * fVar194) & uVar52);
                local_1208[2] =
                     (float)(~uVar57 & (uint)(fVar173 * fVar66 - fStack_12d0 * fVar164) |
                            (uint)(fVar164 * auVar128._8_4_ - fVar66 * fVar195) & uVar57);
                local_1208[3] =
                     (float)(~uVar62 & (uint)(fVar149 * fVar167 - fStack_12cc * fVar165) |
                            (uint)(fVar165 * auVar128._12_4_ - fVar167 * fVar196) & uVar62);
                fVar136 = (float)local_1498._0_4_ * local_1228._0_4_ +
                          fStack_143c * local_1218._0_4_ + fStack_12ac * local_1208[0];
                fVar142 = (float)local_1498._4_4_ * local_1228._4_4_ +
                          fStack_143c * local_1218._4_4_ + fStack_12ac * local_1208[1];
                fVar66 = fStack_1490 * local_1228._8_4_ +
                         fStack_143c * local_1218._8_4_ + fStack_12ac * local_1208[2];
                fVar167 = afStack_148c[0] * local_1228._12_4_ +
                          fStack_143c * local_1218._12_4_ + fStack_12ac * local_1208[3];
                auVar180._0_4_ = fVar136 + fVar136;
                auVar180._4_4_ = fVar142 + fVar142;
                auVar180._8_4_ = fVar66 + fVar66;
                auVar180._12_4_ = fVar167 + fVar167;
                auVar75._0_4_ = (float)local_13c8 * local_1208[0];
                auVar75._4_4_ = local_13c8._4_4_ * local_1208[1];
                auVar75._8_4_ = fStack_13c0 * local_1208[2];
                auVar75._12_4_ = fStack_13bc * local_1208[3];
                fVar171 = (float)local_13b8 * local_1228._0_4_ +
                          (float)local_1478._0_4_ * local_1218._0_4_ + auVar75._0_4_;
                fVar183 = local_13b8._4_4_ * local_1228._4_4_ +
                          (float)local_1478._4_4_ * local_1218._4_4_ + auVar75._4_4_;
                fVar173 = fStack_13b0 * local_1228._8_4_ +
                          fStack_1470 * local_1218._8_4_ + auVar75._8_4_;
                fVar176 = fStack_13ac * local_1228._12_4_ +
                          fStack_146c * local_1218._12_4_ + auVar75._12_4_;
                auVar83 = rcpps(auVar75,auVar180);
                fVar136 = auVar83._0_4_;
                fVar142 = auVar83._4_4_;
                fVar66 = auVar83._8_4_;
                fVar167 = auVar83._12_4_;
                auVar129._0_4_ =
                     ((1.0 - auVar180._0_4_ * fVar136) * fVar136 + fVar136) * (fVar171 + fVar171);
                auVar129._4_4_ =
                     ((1.0 - auVar180._4_4_ * fVar142) * fVar142 + fVar142) * (fVar183 + fVar183);
                auVar129._8_4_ =
                     ((1.0 - auVar180._8_4_ * fVar66) * fVar66 + fVar66) * (fVar173 + fVar173);
                auVar129._12_4_ =
                     ((1.0 - auVar180._12_4_ * fVar167) * fVar167 + fVar167) * (fVar176 + fVar176);
                fVar136 = (ray->super_RayK<1>).tfar;
                uVar49 = (ray->super_RayK<1>).mask;
                fVar142 = (ray->super_RayK<1>).org.field_0.m128[3];
                auVar181._0_4_ =
                     (int)((uint)(auVar180._0_4_ != 0.0 &&
                                 (auVar129._0_4_ <= fVar136 && fVar142 <= auVar129._0_4_)) *
                          -0x80000000) >> 0x1f;
                auVar181._4_4_ =
                     (int)((uint)(auVar180._4_4_ != 0.0 &&
                                 (auVar129._4_4_ <= fVar136 && fVar142 <= auVar129._4_4_)) *
                          -0x80000000) >> 0x1f;
                auVar181._8_4_ =
                     (int)((uint)(auVar180._8_4_ != 0.0 &&
                                 (auVar129._8_4_ <= fVar136 && fVar142 <= auVar129._8_4_)) *
                          -0x80000000) >> 0x1f;
                auVar181._12_4_ =
                     (int)((uint)(auVar180._12_4_ != 0.0 &&
                                 (auVar129._12_4_ <= fVar136 && fVar142 <= auVar129._12_4_)) *
                          -0x80000000) >> 0x1f;
                auVar182 = auVar181 & auVar107;
                iVar39 = movmskps(iVar39,auVar182);
                if (iVar39 != 0) {
                  local_1288 = _local_1468;
                  local_1278 = &local_149d;
                  local_1268 = auVar182;
                  _local_1238 = auVar129;
                  auVar108._4_12_ = auVar107._4_12_;
                  auVar108._0_4_ = (float)(int)(*(ushort *)((long)auVar47 + 8 + local_1360) - 1);
                  auVar154._4_4_ = auVar107._4_4_;
                  auVar154._0_4_ = auVar108._0_4_;
                  auVar154._8_4_ = auVar107._8_4_;
                  auVar154._12_4_ = auVar107._12_4_;
                  auVar83 = rcpss(auVar154,auVar108);
                  auVar163._4_12_ = auVar162._4_12_;
                  auVar163._0_4_ = (float)(int)(*(ushort *)((long)auVar47 + 10 + local_1360) - 1);
                  fStack_129c = (2.0 - auVar108._0_4_ * auVar83._0_4_) * auVar83._0_4_;
                  auVar155._4_4_ = auVar162._4_4_;
                  auVar155._0_4_ = auVar163._0_4_;
                  auVar155._8_4_ = auVar162._8_4_;
                  auVar155._12_4_ = auVar162._12_4_;
                  auVar83 = rcpss(auVar155,auVar163);
                  fVar136 = (2.0 - auVar163._0_4_ * auVar83._0_4_) * auVar83._0_4_;
                  local_12a8._0_4_ =
                       fStack_129c *
                       ((float)(int)local_10f8 * (float)local_1468._0_4_ +
                       ((float)local_1468._0_4_ - fVar114));
                  local_12a8._4_4_ =
                       fStack_129c *
                       ((float)((int)fStack_10f4 + 1) * (float)local_1468._4_4_ +
                       ((float)local_1468._4_4_ - fVar113));
                  fStack_12a0 = fStack_129c *
                                ((float)((int)fStack_10f0 + 1) * fStack_1460 +
                                (fStack_1460 - auVar105._8_4_));
                  fStack_129c = fStack_129c *
                                ((float)(int)fStack_10ec * fStack_145c +
                                (fStack_145c - auVar105._12_4_));
                  auVar141._0_4_ =
                       (float)(int)local_12c8 * (float)local_1468._0_4_ +
                       ((float)local_1468._0_4_ - auVar162._0_4_);
                  auVar141._4_4_ =
                       (float)(int)fStack_12c4 * (float)local_1468._4_4_ +
                       ((float)local_1468._4_4_ - auVar162._4_4_);
                  auVar141._8_4_ =
                       (float)((int)fStack_12c0 + 1) * fStack_1460 + (fStack_1460 - auVar162._8_4_);
                  auVar141._12_4_ =
                       (float)((int)fStack_12bc + 1) * fStack_145c + (fStack_145c - auVar162._12_4_)
                  ;
                  local_1298._0_4_ = fVar136 * auVar141._0_4_;
                  local_1298._4_4_ = fVar136 * auVar141._4_4_;
                  fStack_1290 = fVar136 * auVar141._8_4_;
                  fStack_128c = fVar136 * auVar141._12_4_;
                  pGVar10 = (context->scene->geometries).items[local_1480].ptr;
                  if ((pGVar10->mask & uVar49) != 0) {
                    local_1428 = auVar182;
                    auVar83 = rcpps(auVar141,_local_1468);
                    fVar114 = auVar83._0_4_;
                    fVar113 = auVar83._4_4_;
                    fVar136 = auVar83._8_4_;
                    fVar142 = auVar83._12_4_;
                    local_1318._4_4_ = (undefined4)((ulong)local_1318 >> 0x20);
                    fVar114 = (float)(-(uint)(1e-18 <= (float)local_1318._0_4_) &
                                     (uint)(((float)DAT_01f46a60 - (float)local_1468._0_4_ * fVar114
                                            ) * fVar114 + fVar114));
                    fVar113 = (float)(-(uint)(1e-18 <= (float)local_1318._4_4_) &
                                     (uint)((DAT_01f46a60._4_4_ - (float)local_1468._4_4_ * fVar113)
                                            * fVar113 + fVar113));
                    fVar136 = (float)(-(uint)(1e-18 <= fStack_1310) &
                                     (uint)((DAT_01f46a60._8_4_ - fStack_1460 * fVar136) * fVar136 +
                                           fVar136));
                    fVar142 = (float)(-(uint)(1e-18 <= fStack_130c) &
                                     (uint)((DAT_01f46a60._12_4_ - fStack_145c * fVar142) * fVar142
                                           + fVar142));
                    auVar76._0_4_ = (float)local_12a8._0_4_ * fVar114;
                    auVar76._4_4_ = (float)local_12a8._4_4_ * fVar113;
                    auVar76._8_4_ = fStack_12a0 * fVar136;
                    auVar76._12_4_ = fStack_129c * fVar142;
                    local_1258 = minps(auVar76,_DAT_01f46a60);
                    auVar109._0_4_ = (float)local_1298._0_4_ * fVar114;
                    auVar109._4_4_ = (float)local_1298._4_4_ * fVar113;
                    auVar109._8_4_ = fStack_1290 * fVar136;
                    auVar109._12_4_ = fStack_128c * fVar142;
                    local_1248 = minps(auVar109,_DAT_01f46a60);
                    uVar51 = auVar182._0_4_;
                    auVar130._0_4_ = (uint)auVar129._0_4_ & uVar51;
                    uVar56 = auVar182._4_4_;
                    auVar130._4_4_ = (uint)auVar129._4_4_ & uVar56;
                    uVar61 = auVar182._8_4_;
                    auVar130._8_4_ = (uint)auVar129._8_4_ & uVar61;
                    uVar50 = auVar182._12_4_;
                    auVar130._12_4_ = (uint)auVar129._12_4_ & uVar50;
                    auVar90._0_8_ = CONCAT44(~uVar56,~uVar51) & 0x7f8000007f800000;
                    auVar90._8_4_ = ~uVar61 & 0x7f800000;
                    auVar90._12_4_ = ~uVar50 & 0x7f800000;
                    auVar90 = auVar90 | auVar130;
                    auVar110._4_4_ = auVar90._0_4_;
                    auVar110._0_4_ = auVar90._4_4_;
                    auVar110._8_4_ = auVar90._12_4_;
                    auVar110._12_4_ = auVar90._8_4_;
                    auVar83 = minps(auVar110,auVar90);
                    auVar77._0_8_ = auVar83._8_8_;
                    auVar77._8_4_ = auVar83._0_4_;
                    auVar77._12_4_ = auVar83._4_4_;
                    auVar83 = minps(auVar77,auVar83);
                    auVar78._0_8_ =
                         CONCAT44(-(uint)(auVar83._4_4_ == auVar90._4_4_) & uVar56,
                                  -(uint)(auVar83._0_4_ == auVar90._0_4_) & uVar51);
                    auVar78._8_4_ = -(uint)(auVar83._8_4_ == auVar90._8_4_) & uVar61;
                    auVar78._12_4_ = -(uint)(auVar83._12_4_ == auVar90._12_4_) & uVar50;
                    iVar39 = movmskps(uVar49,auVar78);
                    if (iVar39 != 0) {
                      auVar182._8_4_ = auVar78._8_4_;
                      auVar182._0_8_ = auVar78._0_8_;
                      auVar182._12_4_ = auVar78._12_4_;
                    }
                    uVar49 = movmskps(iVar39,auVar182);
                    lVar36 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                      }
                    }
                    pRVar13 = local_1458->args;
                    if (pRVar13->filter == (RTCFilterFunctionN)0x0) {
                      pRVar48 = local_1458->user;
                      if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar114 = *(float *)(local_1258 + lVar36 * 4);
                        fVar113 = *(float *)(local_1248 + lVar36 * 4);
                        fVar136 = *(float *)(local_1228 + lVar36 * 4);
                        fVar142 = local_1208[lVar36 + -4];
                        fVar66 = local_1208[lVar36];
                        (ray->super_RayK<1>).tfar = *(float *)(local_1238 + lVar36 * 4);
                        (ray->Ng).field_0.field_0.x = fVar136;
                        (ray->Ng).field_0.field_0.y = fVar142;
                        (ray->Ng).field_0.field_0.z = fVar66;
                        ray->u = fVar114;
                        ray->v = fVar113;
                        ray->primID = (uint)local_1450;
                        ray->geomID = (uint)local_1480;
                        ray->instID[0] = pRVar48->instID[0];
                        ray->instPrimID[0] = pRVar48->instPrimID[0];
                        context = local_1458;
                        pauVar41 = local_1418;
                        goto LAB_005a75b5;
                      }
                    }
                    else {
                      pRVar48 = local_1458->user;
                    }
                    uVar30 = (ray->super_RayK<1>).tfar;
                    uVar31 = (ray->super_RayK<1>).mask;
                    uVar32 = (ray->super_RayK<1>).id;
                    fStack_1490 = (float)uVar32;
                    local_1498._4_4_ = uVar31;
                    local_1498._0_4_ = uVar30;
                    afStack_148c[0] = (float)(ray->super_RayK<1>).flags;
                    _local_1478 = auVar129;
                    _local_1318 = auVar115;
                    local_12b8 = fStack_12ac;
                    fStack_12b4 = fStack_12ac;
                    fStack_12b0 = fStack_12ac;
                    while( true ) {
                      local_139c = *(undefined4 *)(local_1258 + lVar36 * 4);
                      local_1398 = *(undefined4 *)(local_1248 + lVar36 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1238 + lVar36 * 4);
                      local_13a8 = *(float *)(local_1228 + lVar36 * 4);
                      local_13a4 = local_1208[lVar36 + -4];
                      local_13a0 = local_1208[lVar36];
                      local_1394 = (int)local_1450;
                      local_1390 = (int)local_1480;
                      local_138c = pRVar48->instID[0];
                      local_1388 = pRVar48->instPrimID[0];
                      local_149c = (undefined1  [4])0xffffffff;
                      local_1408.valid = (int *)local_149c;
                      local_1408.geometryUserPtr = pGVar10->userPtr;
                      local_1408.context = pRVar48;
                      local_1408.ray = (RTCRayN *)ray;
                      local_1408.hit = (RTCHitN *)&local_13a8;
                      local_1408.N = 1;
                      if (((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                          ((*pGVar10->intersectionFilterN)(&local_1408), auVar129 = _local_1478,
                          (((RayK<1> *)local_1408.valid)->org).field_0.m128[0] != 0.0)) &&
                         (((pRVar13->filter == (RTCFilterFunctionN)0x0 ||
                           (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                             RTC_RAY_QUERY_FLAG_INCOHERENT &&
                            (((pGVar10->field_8).field_0x2 & 0x40) == 0)))) ||
                          ((*pRVar13->filter)(&local_1408), auVar129 = _local_1478,
                          (((RayK<1> *)local_1408.valid)->org).field_0.m128[0] != 0.0)))) {
                        (((Vec3f *)((long)local_1408.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1408.hit;
                        (((Vec3f *)((long)local_1408.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1408.hit + 4);
                        (((Vec3f *)((long)local_1408.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1408.hit + 8);
                        *(float *)((long)local_1408.ray + 0x3c) = *(float *)(local_1408.hit + 0xc);
                        *(float *)((long)local_1408.ray + 0x40) = *(float *)(local_1408.hit + 0x10);
                        *(float *)((long)local_1408.ray + 0x44) = *(float *)(local_1408.hit + 0x14);
                        *(float *)((long)local_1408.ray + 0x48) = *(float *)(local_1408.hit + 0x18);
                        *(float *)((long)local_1408.ray + 0x4c) = *(float *)(local_1408.hit + 0x1c);
                        *(float *)((long)local_1408.ray + 0x50) = *(float *)(local_1408.hit + 0x20);
                        pRVar38 = (RayHit *)local_1408.ray;
                      }
                      else {
                        (ray->super_RayK<1>).tfar = (float)local_1498._0_4_;
                        pRVar38 = (RayHit *)local_1408.valid;
                        auVar129 = _local_1478;
                      }
                      *(undefined4 *)(local_1428 + lVar36 * 4) = 0;
                      local_1498._0_4_ = (ray->super_RayK<1>).tfar;
                      local_1498._4_4_ = (ray->super_RayK<1>).mask;
                      fStack_1490 = (float)(ray->super_RayK<1>).id;
                      afStack_148c[0] = (float)(ray->super_RayK<1>).flags;
                      auVar80._0_4_ =
                           -(uint)(auVar129._0_4_ <= (float)local_1498._0_4_) & local_1428._0_4_;
                      auVar80._4_4_ =
                           -(uint)(auVar129._4_4_ <= (float)local_1498._0_4_) & local_1428._4_4_;
                      auVar80._8_4_ =
                           -(uint)(auVar129._8_4_ <= (float)local_1498._0_4_) & local_1428._8_4_;
                      auVar80._12_4_ =
                           -(uint)(auVar129._12_4_ <= (float)local_1498._0_4_) & local_1428._12_4_;
                      local_1428 = auVar80;
                      iVar39 = movmskps((int)pRVar38,auVar80);
                      context = local_1458;
                      uVar40 = local_1190;
                      pauVar41 = local_1418;
                      uVar42 = local_1180;
                      uVar44 = local_1188;
                      fVar133 = fStack_1050;
                      fVar134 = fStack_104c;
                      fVar186 = local_10a8;
                      fVar175 = fStack_10a4;
                      fVar177 = fStack_10a0;
                      fVar178 = fStack_109c;
                      if (iVar39 == 0) break;
                      auVar94._0_4_ = auVar80._0_4_ & (uint)auVar129._0_4_;
                      auVar94._4_4_ = auVar80._4_4_ & (uint)auVar129._4_4_;
                      auVar94._8_4_ = auVar80._8_4_ & (uint)auVar129._8_4_;
                      auVar94._12_4_ = auVar80._12_4_ & (uint)auVar129._12_4_;
                      auVar112._0_8_ = CONCAT44(~auVar80._4_4_,~auVar80._0_4_) & 0x7f8000007f800000;
                      auVar112._8_4_ = ~auVar80._8_4_ & 0x7f800000;
                      auVar112._12_4_ = ~auVar80._12_4_ & 0x7f800000;
                      auVar112 = auVar112 | auVar94;
                      auVar132._4_4_ = auVar112._0_4_;
                      auVar132._0_4_ = auVar112._4_4_;
                      auVar132._8_4_ = auVar112._12_4_;
                      auVar132._12_4_ = auVar112._8_4_;
                      auVar115 = minps(auVar132,auVar112);
                      auVar95._0_8_ = auVar115._8_8_;
                      auVar95._8_4_ = auVar115._0_4_;
                      auVar95._12_4_ = auVar115._4_4_;
                      auVar115 = minps(auVar95,auVar115);
                      auVar96._0_8_ =
                           CONCAT44(-(uint)(auVar115._4_4_ == auVar112._4_4_) & auVar80._4_4_,
                                    -(uint)(auVar115._0_4_ == auVar112._0_4_) & auVar80._0_4_);
                      auVar96._8_4_ = -(uint)(auVar115._8_4_ == auVar112._8_4_) & auVar80._8_4_;
                      auVar96._12_4_ = -(uint)(auVar115._12_4_ == auVar112._12_4_) & auVar80._12_4_;
                      iVar39 = movmskps(iVar39,auVar96);
                      if (iVar39 != 0) {
                        auVar80._8_4_ = auVar96._8_4_;
                        auVar80._0_8_ = auVar96._0_8_;
                        auVar80._12_4_ = auVar96._12_4_;
                      }
                      uVar45 = movmskps(iVar39,auVar80);
                      uVar40 = CONCAT44((int)((ulong)pRVar38 >> 0x20),uVar45);
                      lVar36 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_005a75b5;
          }
          unaff_R12 = 0;
          auVar146 = _local_1148;
          auVar160 = local_1138;
          fVar167 = local_11f8;
          fVar114 = fStack_11f4;
          fVar66 = fStack_11f0;
          fVar176 = fStack_11ec;
          fVar171 = local_10e8;
          fVar135 = fStack_10e4;
          fVar149 = fStack_10e0;
          fVar156 = fStack_10dc;
          fVar142 = local_10b8;
          fVar157 = fStack_10b4;
          fVar158 = fStack_10b0;
          fVar159 = fStack_10ac;
          fVar183 = local_1358;
          fVar164 = fStack_1354;
          fVar165 = fStack_1350;
          fVar166 = fStack_134c;
          fVar173 = local_10c8;
          fVar168 = fStack_10c4;
          fVar172 = fStack_10c0;
          fVar174 = fStack_10bc;
          fVar113 = local_1158;
          fVar184 = fStack_1154;
          fVar185 = fStack_1150;
          fVar187 = fStack_114c;
          fVar136 = local_10d8;
          fVar188 = fStack_10d4;
          fVar189 = fStack_10d0;
          fVar190 = fStack_10cc;
        }
        local_1058 = (ray->super_RayK<1>).tfar;
        fStack_1054 = local_1058;
        fVar133 = local_1058;
        fVar134 = local_1058;
      }
      goto LAB_005a7047;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }